

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conelinei_intersector.h
# Opt level: O1

void embree::avx2::ConeCurveMiIntersectorK<8,_8,_true>::intersect
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *line)

{
  undefined4 uVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  Geometry *pGVar10;
  long lVar11;
  RTCFilterFunctionN p_Var12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  undefined1 auVar21 [32];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  float fVar28;
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  float fVar33;
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  uint uVar62;
  uint uVar63;
  int iVar64;
  Scene *pSVar65;
  ulong uVar66;
  undefined4 uVar67;
  float fVar68;
  float fVar79;
  float fVar80;
  float fVar82;
  float fVar84;
  float fVar86;
  float fVar88;
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  float fVar81;
  float fVar83;
  float fVar85;
  float fVar87;
  float fVar89;
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [64];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  float fVar100;
  float fVar101;
  float fVar107;
  float fVar109;
  float fVar111;
  float fVar113;
  float fVar115;
  float fVar116;
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  float fVar108;
  float fVar110;
  float fVar112;
  float fVar114;
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  float fVar117;
  undefined1 auVar118 [16];
  float fVar128;
  float fVar129;
  undefined1 auVar119 [32];
  float fVar130;
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  float fVar131;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  undefined1 auVar132 [32];
  undefined1 auVar133 [64];
  float fVar140;
  float fVar148;
  float fVar149;
  float fVar150;
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [64];
  float fVar151;
  float fVar158;
  float fVar159;
  float fVar160;
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [64];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [64];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  float fVar170;
  undefined1 auVar169 [64];
  float fVar171;
  undefined1 auVar172 [28];
  float fVar176;
  float fVar177;
  float fVar178;
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [64];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [64];
  undefined1 auVar182 [64];
  undefined1 auVar183 [32];
  undefined1 auVar184 [64];
  float fVar185;
  undefined1 auVar186 [32];
  float fVar188;
  float fVar189;
  float fVar190;
  float fVar191;
  float fVar192;
  float fVar193;
  undefined1 auVar187 [64];
  float fVar194;
  float fVar198;
  float fVar199;
  float fVar200;
  float fVar201;
  float fVar202;
  float fVar203;
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [64];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [64];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  RoundLineIntersectorHitM<8> hit;
  RTCFilterFunctionNArguments local_6d0;
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  undefined4 uStack_5e4;
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [16];
  undefined1 auStack_530 [16];
  undefined1 local_520 [16];
  undefined1 auStack_510 [16];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  float local_340;
  float fStack_33c;
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  undefined1 local_320 [32];
  float local_300;
  float fStack_2fc;
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  undefined4 uStack_2e4;
  float local_2e0;
  float fStack_2dc;
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  float local_2c0;
  float fStack_2bc;
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined4 local_240;
  undefined4 uStack_23c;
  undefined4 uStack_238;
  undefined4 uStack_234;
  undefined4 uStack_230;
  undefined4 uStack_22c;
  undefined4 uStack_228;
  undefined4 uStack_224;
  undefined4 local_220;
  undefined4 uStack_21c;
  undefined4 uStack_218;
  undefined4 uStack_214;
  undefined4 uStack_210;
  undefined4 uStack_20c;
  undefined4 uStack_208;
  undefined4 uStack_204;
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  uint local_1c0;
  uint uStack_1bc;
  uint uStack_1b8;
  uint uStack_1b4;
  uint uStack_1b0;
  uint uStack_1ac;
  uint uStack_1a8;
  uint uStack_1a4;
  uint local_1a0;
  uint uStack_19c;
  uint uStack_198;
  uint uStack_194;
  uint uStack_190;
  uint uStack_18c;
  uint uStack_188;
  uint uStack_184;
  undefined1 local_180 [8];
  float fStack_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  undefined4 uStack_164;
  uint local_160 [4];
  uint uStack_150;
  uint uStack_14c;
  uint uStack_148;
  uint uStack_144;
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  float local_100;
  float fStack_fc;
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  undefined1 local_e0 [32];
  float local_c0;
  float fStack_bc;
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  float fStack_a4;
  float local_a0;
  float fStack_9c;
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  undefined1 local_80 [32];
  undefined1 auVar127 [32];
  
  local_560._0_8_ = context;
  pSVar65 = context->scene;
  local_160[0] = line->sharedGeomID;
  uVar63 = (line->v0).field_0.i[0];
  pGVar10 = (pSVar65->geometries).items[local_160[0]].ptr;
  lVar11 = *(long *)&pGVar10[1].time_range.upper;
  p_Var12 = pGVar10[1].intersectionFilterN;
  uVar62 = (line->v0).field_0.i[1];
  uVar4 = (line->v0).field_0.i[2];
  uVar5 = (line->v0).field_0.i[4];
  auVar118 = *(undefined1 (*) [16])(lVar11 + (ulong)uVar5 * (long)p_Var12);
  auVar69._0_16_ =
       ZEXT116(0) * auVar118 +
       ZEXT116(1) * *(undefined1 (*) [16])(lVar11 + (ulong)uVar63 * (long)p_Var12);
  auVar69._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar118;
  uVar6 = (line->v0).field_0.i[3];
  uVar7 = (line->v0).field_0.i[5];
  auVar118 = *(undefined1 (*) [16])(lVar11 + (ulong)uVar7 * (long)p_Var12);
  auVar90._0_16_ =
       ZEXT116(0) * auVar118 +
       ZEXT116(1) * *(undefined1 (*) [16])(lVar11 + (ulong)uVar62 * (long)p_Var12);
  auVar90._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar118;
  uVar8 = (line->v0).field_0.i[6];
  auVar118 = *(undefined1 (*) [16])(lVar11 + (ulong)uVar8 * (long)p_Var12);
  auVar102._0_16_ =
       ZEXT116(0) * auVar118 +
       ZEXT116(1) * *(undefined1 (*) [16])(lVar11 + (ulong)uVar4 * (long)p_Var12);
  auVar102._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar118;
  uVar9 = (line->v0).field_0.i[7];
  auVar118 = *(undefined1 (*) [16])(lVar11 + (ulong)uVar9 * (long)p_Var12);
  auVar119._0_16_ =
       ZEXT116(0) * auVar118 +
       ZEXT116(1) * *(undefined1 (*) [16])(lVar11 + (ulong)uVar6 * (long)p_Var12);
  auVar119._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar118;
  auVar165._16_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)(uVar5 + 1) * (long)p_Var12);
  auVar165._0_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)(uVar63 + 1) * (long)p_Var12);
  auVar141._16_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)(uVar7 + 1) * (long)p_Var12);
  auVar141._0_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)(uVar62 + 1) * (long)p_Var12);
  auVar152._16_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)(uVar8 + 1) * (long)p_Var12);
  auVar152._0_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)(uVar4 + 1) * (long)p_Var12);
  auVar161._16_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)(uVar9 + 1) * (long)p_Var12);
  auVar161._0_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)(uVar6 + 1) * (long)p_Var12);
  auVar167 = vpunpckldq_avx2(auVar69,auVar102);
  auVar124 = vpunpckhdq_avx2(auVar69,auVar102);
  auVar155 = vpunpckldq_avx2(auVar90,auVar119);
  auVar146 = vpunpckhdq_avx2(auVar90,auVar119);
  auVar97 = vpunpckldq_avx2(auVar167,auVar155);
  auVar186 = vpunpckhdq_avx2(auVar167,auVar155);
  auVar21 = vpunpckldq_avx2(auVar124,auVar146);
  auVar103 = vpunpckhdq_avx2(auVar124,auVar146);
  auVar124 = vunpcklps_avx(auVar165,auVar152);
  auVar146 = vunpckhps_avx(auVar165,auVar152);
  auVar69 = vunpcklps_avx(auVar141,auVar161);
  auVar155 = vunpckhps_avx(auVar141,auVar161);
  auVar90 = vunpcklps_avx(auVar124,auVar69);
  uVar2 = line->leftExists;
  uVar3 = line->rightExists;
  auVar167 = vpcmpeqd_avx2(auVar167,auVar167);
  auVar119 = vpcmpeqd_avx2(auVar167,(undefined1  [32])(line->primIDs).field_0);
  local_160[1] = local_160[0];
  local_160[2] = local_160[0];
  local_160[3] = local_160[0];
  uStack_150 = local_160[0];
  uStack_14c = local_160[0];
  uStack_148 = local_160[0];
  uStack_144 = local_160[0];
  fStack_2c4 = *(float *)(ray + k * 4 + 0x80);
  local_660._4_4_ = fStack_2c4;
  local_660._0_4_ = fStack_2c4;
  local_660._8_4_ = fStack_2c4;
  local_660._12_4_ = fStack_2c4;
  local_660._16_4_ = fStack_2c4;
  local_660._20_4_ = fStack_2c4;
  local_660._24_4_ = fStack_2c4;
  local_660._28_4_ = fStack_2c4;
  fVar194 = *(float *)(ray + k * 4 + 0xa0);
  local_320._4_4_ = fVar194;
  local_320._0_4_ = fVar194;
  local_320._8_4_ = fVar194;
  local_320._12_4_ = fVar194;
  local_320._16_4_ = fVar194;
  local_320._20_4_ = fVar194;
  local_320._24_4_ = fVar194;
  local_320._28_4_ = fVar194;
  local_340 = *(float *)(ray + k * 4 + 0xc0);
  auVar69 = vunpckhps_avx(auVar124,auVar69);
  auVar118 = vfmadd231ps_fma(ZEXT432((uint)(local_340 * local_340)),local_320,local_320);
  auVar118 = vfmadd231ps_fma(ZEXT1632(auVar118),local_660,local_660);
  uVar67 = auVar118._0_4_;
  auVar153._4_4_ = uVar67;
  auVar153._0_4_ = uVar67;
  auVar153._8_4_ = uVar67;
  auVar153._12_4_ = uVar67;
  auVar153._16_4_ = uVar67;
  auVar153._20_4_ = uVar67;
  auVar153._24_4_ = uVar67;
  auVar153._28_4_ = uVar67;
  auVar124 = vrcpps_avx(auVar153);
  auVar102 = vunpcklps_avx(auVar146,auVar155);
  auVar167 = vunpckhps_avx(auVar146,auVar155);
  auVar91._8_4_ = 0x3f800000;
  auVar91._0_8_ = &DAT_3f8000003f800000;
  auVar91._12_4_ = 0x3f800000;
  auVar91._16_4_ = 0x3f800000;
  auVar91._20_4_ = 0x3f800000;
  auVar91._24_4_ = 0x3f800000;
  auVar91._28_4_ = 0x3f800000;
  auVar118 = vfnmadd213ps_fma(auVar153,auVar124,auVar91);
  auVar118 = vfmadd132ps_fma(ZEXT1632(auVar118),auVar124,auVar124);
  auVar155._4_4_ = (auVar97._4_4_ + auVar90._4_4_) * 0.5;
  auVar155._0_4_ = (auVar97._0_4_ + auVar90._0_4_) * 0.5;
  auVar155._8_4_ = (auVar97._8_4_ + auVar90._8_4_) * 0.5;
  auVar155._12_4_ = (auVar97._12_4_ + auVar90._12_4_) * 0.5;
  auVar155._16_4_ = (auVar97._16_4_ + auVar90._16_4_) * 0.5;
  auVar155._20_4_ = (auVar97._20_4_ + auVar90._20_4_) * 0.5;
  auVar155._24_4_ = (auVar97._24_4_ + auVar90._24_4_) * 0.5;
  auVar155._28_4_ = auVar97._28_4_ + auVar90._28_4_;
  auVar124._4_4_ = (auVar69._4_4_ + auVar186._4_4_) * 0.5;
  auVar124._0_4_ = (auVar69._0_4_ + auVar186._0_4_) * 0.5;
  auVar124._8_4_ = (auVar69._8_4_ + auVar186._8_4_) * 0.5;
  auVar124._12_4_ = (auVar69._12_4_ + auVar186._12_4_) * 0.5;
  auVar124._16_4_ = (auVar69._16_4_ + auVar186._16_4_) * 0.5;
  auVar124._20_4_ = (auVar69._20_4_ + auVar186._20_4_) * 0.5;
  auVar124._24_4_ = (auVar69._24_4_ + auVar186._24_4_) * 0.5;
  auVar124._28_4_ = auVar69._28_4_ + auVar186._28_4_;
  auVar146._4_4_ = (auVar21._4_4_ + auVar102._4_4_) * 0.5;
  auVar146._0_4_ = (auVar21._0_4_ + auVar102._0_4_) * 0.5;
  auVar146._8_4_ = (auVar21._8_4_ + auVar102._8_4_) * 0.5;
  auVar146._12_4_ = (auVar21._12_4_ + auVar102._12_4_) * 0.5;
  auVar146._16_4_ = (auVar21._16_4_ + auVar102._16_4_) * 0.5;
  auVar146._20_4_ = (auVar21._20_4_ + auVar102._20_4_) * 0.5;
  auVar146._24_4_ = (auVar21._24_4_ + auVar102._24_4_) * 0.5;
  auVar146._28_4_ = 0x3f000000;
  fVar198 = *(float *)(ray + k * 4 + 0x20);
  auVar173._4_4_ = fVar198;
  auVar173._0_4_ = fVar198;
  auVar173._8_4_ = fVar198;
  auVar173._12_4_ = fVar198;
  auVar173._16_4_ = fVar198;
  auVar173._20_4_ = fVar198;
  auVar173._24_4_ = fVar198;
  auVar173._28_4_ = fVar198;
  auVar124 = vsubps_avx(auVar124,auVar173);
  fVar199 = *(float *)(ray + k * 4 + 0x40);
  auVar179._4_4_ = fVar199;
  auVar179._0_4_ = fVar199;
  auVar179._8_4_ = fVar199;
  auVar179._12_4_ = fVar199;
  auVar179._16_4_ = fVar199;
  auVar179._20_4_ = fVar199;
  auVar179._24_4_ = fVar199;
  auVar179._28_4_ = fVar199;
  auVar146 = vsubps_avx(auVar146,auVar179);
  auVar26._4_4_ = local_340 * auVar146._4_4_;
  auVar26._0_4_ = local_340 * auVar146._0_4_;
  auVar26._8_4_ = local_340 * auVar146._8_4_;
  auVar26._12_4_ = local_340 * auVar146._12_4_;
  auVar26._16_4_ = local_340 * auVar146._16_4_;
  auVar26._20_4_ = local_340 * auVar146._20_4_;
  auVar26._24_4_ = local_340 * auVar146._24_4_;
  auVar26._28_4_ = auVar146._28_4_;
  auVar23 = vfmadd231ps_fma(auVar26,local_320,auVar124);
  fVar200 = *(float *)(ray + k * 4);
  auVar166._4_4_ = fVar200;
  auVar166._0_4_ = fVar200;
  auVar166._8_4_ = fVar200;
  auVar166._12_4_ = fVar200;
  auVar166._16_4_ = fVar200;
  auVar166._20_4_ = fVar200;
  auVar166._24_4_ = fVar200;
  auVar166._28_4_ = fVar200;
  auVar124 = vsubps_avx(auVar155,auVar166);
  auVar23 = vfmadd231ps_fma(ZEXT1632(auVar23),local_660,auVar124);
  fVar140 = auVar23._0_4_ * auVar118._0_4_;
  fVar148 = auVar23._4_4_ * auVar118._4_4_;
  fVar149 = auVar23._8_4_ * auVar118._8_4_;
  fVar150 = auVar23._12_4_ * auVar118._12_4_;
  fStack_a4 = auVar124._28_4_;
  auVar154._0_4_ = fVar200 + fStack_2c4 * fVar140;
  auVar154._4_4_ = fVar200 + fStack_2c4 * fVar148;
  auVar154._8_4_ = fVar200 + fStack_2c4 * fVar149;
  auVar154._12_4_ = fVar200 + fStack_2c4 * fVar150;
  auVar154._16_4_ = fVar200 + fStack_2c4 * 0.0;
  auVar154._20_4_ = fVar200 + fStack_2c4 * 0.0;
  auVar154._24_4_ = fVar200 + fStack_2c4 * 0.0;
  auVar154._28_4_ = fVar200 + 0.0;
  auVar174._0_4_ = fVar198 + fVar194 * fVar140;
  auVar174._4_4_ = fVar198 + fVar194 * fVar148;
  auVar174._8_4_ = fVar198 + fVar194 * fVar149;
  auVar174._12_4_ = fVar198 + fVar194 * fVar150;
  auVar174._16_4_ = fVar198 + fVar194 * 0.0;
  auVar174._20_4_ = fVar198 + fVar194 * 0.0;
  auVar174._24_4_ = fVar198 + fVar194 * 0.0;
  auVar174._28_4_ = fVar198 + 0.0;
  auVar142._0_4_ = fVar199 + local_340 * fVar140;
  auVar142._4_4_ = fVar199 + local_340 * fVar148;
  auVar142._8_4_ = fVar199 + local_340 * fVar149;
  auVar142._12_4_ = fVar199 + local_340 * fVar150;
  auVar142._16_4_ = fVar199 + local_340 * 0.0;
  auVar142._20_4_ = fVar199 + local_340 * 0.0;
  auVar142._24_4_ = fVar199 + local_340 * 0.0;
  auVar142._28_4_ = fVar199 + 0.0;
  local_4e0 = vsubps_avx(auVar90,auVar97);
  _local_4a0 = vsubps_avx(auVar154,auVar97);
  local_640 = vsubps_avx(auVar69,auVar186);
  _local_4c0 = vsubps_avx(auVar174,auVar186);
  local_380 = vsubps_avx(auVar102,auVar21);
  local_360 = vsubps_avx(auVar142,auVar21);
  fVar202 = local_380._0_4_;
  fVar14 = local_380._4_4_;
  auVar186._4_4_ = fVar14 * fVar14;
  auVar186._0_4_ = fVar202 * fVar202;
  fVar16 = local_380._8_4_;
  auVar186._8_4_ = fVar16 * fVar16;
  fVar17 = local_380._12_4_;
  auVar186._12_4_ = fVar17 * fVar17;
  fVar18 = local_380._16_4_;
  auVar186._16_4_ = fVar18 * fVar18;
  fVar19 = local_380._20_4_;
  auVar186._20_4_ = fVar19 * fVar19;
  fVar20 = local_380._24_4_;
  auVar186._24_4_ = fVar20 * fVar20;
  auVar186._28_4_ = auVar97._28_4_;
  auVar118 = vfmadd231ps_fma(auVar186,local_640,local_640);
  auVar118 = vfmadd231ps_fma(ZEXT1632(auVar118),local_4e0,local_4e0);
  fVar185 = local_360._0_4_;
  fVar188 = local_360._4_4_;
  auVar97._4_4_ = fVar188 * fVar14;
  auVar97._0_4_ = fVar185 * fVar202;
  fVar189 = local_360._8_4_;
  auVar97._8_4_ = fVar189 * fVar16;
  fVar190 = local_360._12_4_;
  auVar97._12_4_ = fVar190 * fVar17;
  fVar191 = local_360._16_4_;
  auVar97._16_4_ = fVar191 * fVar18;
  fVar192 = local_360._20_4_;
  auVar97._20_4_ = fVar192 * fVar19;
  fVar193 = local_360._24_4_;
  auVar97._24_4_ = fVar193 * fVar20;
  auVar97._28_4_ = fVar199;
  auVar23 = vfmadd231ps_fma(auVar97,_local_4c0,local_640);
  auVar23 = vfmadd231ps_fma(ZEXT1632(auVar23),_local_4a0,local_4e0);
  auVar27._4_4_ = local_340 * fVar14;
  auVar27._0_4_ = local_340 * fVar202;
  auVar27._8_4_ = local_340 * fVar16;
  auVar27._12_4_ = local_340 * fVar17;
  auVar27._16_4_ = local_340 * fVar18;
  auVar27._20_4_ = local_340 * fVar19;
  auVar27._24_4_ = local_340 * fVar20;
  auVar27._28_4_ = auVar174._28_4_;
  auVar24 = vfmadd231ps_fma(auVar27,local_320,local_640);
  auVar24 = vfmadd231ps_fma(ZEXT1632(auVar24),local_660,local_4e0);
  auVar124 = vsubps_avx(auVar103,auVar167);
  fVar203 = auVar124._0_4_;
  fVar15 = auVar124._4_4_;
  fVar83 = auVar124._8_4_;
  fVar87 = auVar124._12_4_;
  fVar101 = auVar124._16_4_;
  fVar108 = auVar124._20_4_;
  fVar110 = auVar124._24_4_;
  fVar28 = local_4e0._28_4_;
  fVar198 = auVar118._0_4_;
  fVar68 = fVar203 * fVar203 + fVar198;
  fVar199 = auVar118._4_4_;
  fVar79 = fVar15 * fVar15 + fVar199;
  fVar200 = auVar118._8_4_;
  fVar80 = fVar83 * fVar83 + fVar200;
  fVar201 = auVar118._12_4_;
  fVar82 = fVar87 * fVar87 + fVar201;
  fVar84 = fVar101 * fVar101 + 0.0;
  fVar86 = fVar108 * fVar108 + 0.0;
  fVar88 = fVar110 * fVar110 + 0.0;
  fStack_33c = local_340;
  fStack_338 = local_340;
  fStack_334 = local_340;
  fStack_330 = local_340;
  fStack_32c = local_340;
  fStack_328 = local_340;
  fStack_324 = local_340;
  auVar29._4_4_ = local_340 * fVar188;
  auVar29._0_4_ = local_340 * fVar185;
  auVar29._8_4_ = local_340 * fVar189;
  auVar29._12_4_ = local_340 * fVar190;
  auVar29._16_4_ = local_340 * fVar191;
  auVar29._20_4_ = local_340 * fVar192;
  auVar29._24_4_ = local_340 * fVar193;
  auVar29._28_4_ = fVar28;
  auVar25 = vfmadd231ps_fma(auVar29,local_320,_local_4c0);
  auVar25 = vfmadd231ps_fma(ZEXT1632(auVar25),local_660,_local_4a0);
  fVar117 = fVar198 * fVar198;
  fVar128 = fVar199 * fVar199;
  fVar129 = fVar200 * fVar200;
  fVar130 = fVar201 * fVar201;
  uStack_164 = local_380._28_4_;
  _local_180 = ZEXT1628(CONCAT412(fVar130,CONCAT48(fVar129,CONCAT44(fVar128,fVar117))));
  fVar13 = auVar23._0_4_;
  fVar171 = auVar24._0_4_;
  fVar81 = auVar23._4_4_;
  fVar176 = auVar24._4_4_;
  fVar85 = auVar23._8_4_;
  fVar177 = auVar24._8_4_;
  fVar89 = auVar23._12_4_;
  fVar178 = auVar24._12_4_;
  fVar112 = auVar21._28_4_;
  auVar21._4_4_ = fVar79 * fVar176 * fVar81;
  auVar21._0_4_ = fVar68 * fVar171 * fVar13;
  auVar21._8_4_ = fVar80 * fVar177 * fVar85;
  auVar21._12_4_ = fVar82 * fVar178 * fVar89;
  auVar21._16_4_ = fVar84 * 0.0;
  auVar21._20_4_ = fVar86 * 0.0;
  auVar21._24_4_ = fVar88 * 0.0;
  auVar21._28_4_ = fVar112;
  auVar146 = vsubps_avx(ZEXT1632(CONCAT412(fVar130 * auVar25._12_4_,
                                           CONCAT48(fVar129 * auVar25._8_4_,
                                                    CONCAT44(fVar128 * auVar25._4_4_,
                                                             fVar117 * auVar25._0_4_)))),auVar21);
  auVar97 = ZEXT1632(auVar118);
  fVar131 = auVar103._0_4_;
  fVar100 = fVar131 * fVar198;
  fVar134 = auVar103._4_4_;
  fVar107 = fVar134 * fVar199;
  auVar30._4_4_ = fVar107;
  auVar30._0_4_ = fVar100;
  fVar135 = auVar103._8_4_;
  fVar109 = fVar135 * fVar200;
  auVar30._8_4_ = fVar109;
  fVar136 = auVar103._12_4_;
  fVar111 = fVar136 * fVar201;
  auVar30._12_4_ = fVar111;
  fVar137 = auVar103._16_4_;
  fVar113 = fVar137 * 0.0;
  auVar30._16_4_ = fVar113;
  fVar138 = auVar103._20_4_;
  fVar115 = fVar138 * 0.0;
  auVar30._20_4_ = fVar115;
  fVar139 = auVar103._24_4_;
  fVar116 = fVar139 * 0.0;
  auVar30._24_4_ = fVar116;
  auVar30._28_4_ = fVar112;
  fVar114 = auVar103._28_4_;
  auVar92._0_4_ = fVar171 * fVar203 * fVar100 + auVar146._0_4_;
  auVar92._4_4_ = fVar176 * fVar15 * fVar107 + auVar146._4_4_;
  auVar92._8_4_ = fVar177 * fVar83 * fVar109 + auVar146._8_4_;
  auVar92._12_4_ = fVar178 * fVar87 * fVar111 + auVar146._12_4_;
  auVar92._16_4_ = fVar101 * 0.0 * fVar113 + auVar146._16_4_;
  auVar92._20_4_ = fVar108 * 0.0 * fVar115 + auVar146._20_4_;
  auVar92._24_4_ = fVar110 * 0.0 * fVar116 + auVar146._24_4_;
  auVar92._28_4_ = fVar114 + auVar146._28_4_;
  auVar103._4_4_ = fVar188 * fVar188;
  auVar103._0_4_ = fVar185 * fVar185;
  auVar103._8_4_ = fVar189 * fVar189;
  auVar103._12_4_ = fVar190 * fVar190;
  auVar103._16_4_ = fVar191 * fVar191;
  auVar103._20_4_ = fVar192 * fVar192;
  auVar103._24_4_ = fVar193 * fVar193;
  auVar103._28_4_ = fVar114;
  auVar118 = vfmadd231ps_fma(auVar103,_local_4c0,_local_4c0);
  auVar118 = vfmadd231ps_fma(ZEXT1632(auVar118),_local_4a0,_local_4a0);
  auVar31._4_4_ = fVar81 * fVar81 * fVar79;
  auVar31._0_4_ = fVar13 * fVar13 * fVar68;
  auVar31._8_4_ = fVar85 * fVar85 * fVar80;
  auVar31._12_4_ = fVar89 * fVar89 * fVar82;
  auVar31._16_4_ = fVar84 * 0.0;
  auVar31._20_4_ = fVar86 * 0.0;
  auVar31._24_4_ = fVar88 * 0.0;
  auVar31._28_4_ = fStack_2c4;
  auVar146 = vsubps_avx(ZEXT1632(CONCAT412(auVar118._12_4_ * fVar130,
                                           CONCAT48(auVar118._8_4_ * fVar129,
                                                    CONCAT44(auVar118._4_4_ * fVar128,
                                                             auVar118._0_4_ * fVar117)))),auVar31);
  auVar32._4_4_ = (fVar15 + fVar15) * fVar81;
  auVar32._0_4_ = (fVar203 + fVar203) * fVar13;
  auVar32._8_4_ = (fVar83 + fVar83) * fVar85;
  auVar32._12_4_ = (fVar87 + fVar87) * fVar89;
  auVar32._16_4_ = (fVar101 + fVar101) * 0.0;
  auVar32._20_4_ = (fVar108 + fVar108) * 0.0;
  auVar32._24_4_ = (fVar110 + fVar110) * 0.0;
  auVar32._28_4_ = auVar124._28_4_ + auVar124._28_4_;
  auVar124 = vsubps_avx(auVar32,auVar30);
  fVar170 = auVar146._28_4_;
  fVar151 = fVar171 * fVar171;
  fVar158 = fVar176 * fVar176;
  fVar159 = fVar177 * fVar177;
  fVar160 = fVar178 * fVar178;
  fVar33 = local_4c0._28_4_;
  auVar34._4_4_ = fVar79 * fVar158;
  auVar34._0_4_ = fVar68 * fVar151;
  auVar34._8_4_ = fVar80 * fVar159;
  auVar34._12_4_ = fVar82 * fVar160;
  auVar34._16_4_ = fVar84 * 0.0;
  auVar34._20_4_ = fVar86 * 0.0;
  auVar34._24_4_ = fVar88 * 0.0;
  auVar34._28_4_ = fVar170;
  auVar155 = vsubps_avx(_local_180,auVar34);
  auVar35._4_4_ = auVar155._4_4_ * (auVar146._4_4_ + auVar124._4_4_ * fVar107);
  auVar35._0_4_ = auVar155._0_4_ * (auVar146._0_4_ + auVar124._0_4_ * fVar100);
  auVar35._8_4_ = auVar155._8_4_ * (auVar146._8_4_ + auVar124._8_4_ * fVar109);
  auVar35._12_4_ = auVar155._12_4_ * (auVar146._12_4_ + auVar124._12_4_ * fVar111);
  auVar35._16_4_ = auVar155._16_4_ * (auVar146._16_4_ + auVar124._16_4_ * fVar113);
  auVar35._20_4_ = auVar155._20_4_ * (auVar146._20_4_ + auVar124._20_4_ * fVar115);
  auVar35._24_4_ = auVar155._24_4_ * (auVar146._24_4_ + auVar124._24_4_ * fVar116);
  auVar35._28_4_ = fVar170 + fVar112;
  auVar36._4_4_ = auVar92._4_4_ * auVar92._4_4_;
  auVar36._0_4_ = auVar92._0_4_ * auVar92._0_4_;
  auVar36._8_4_ = auVar92._8_4_ * auVar92._8_4_;
  auVar36._12_4_ = auVar92._12_4_ * auVar92._12_4_;
  auVar36._16_4_ = auVar92._16_4_ * auVar92._16_4_;
  auVar36._20_4_ = auVar92._20_4_ * auVar92._20_4_;
  auVar36._24_4_ = auVar92._24_4_ * auVar92._24_4_;
  auVar36._28_4_ = fVar170;
  auVar146 = vsubps_avx(auVar36,auVar35);
  auVar103 = ZEXT1232(ZEXT412(0)) << 0x20;
  auVar124 = vcmpps_avx(auVar146,auVar103,5);
  auVar186 = auVar124 & ~auVar119;
  if ((((((((auVar186 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar186 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar186 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar186 >> 0x7f,0) != '\0') ||
        (auVar186 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar186 >> 0xbf,0) != '\0') ||
      (auVar186 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar186[0x1f] < '\0')
  {
    auVar124 = vandnps_avx(auVar119,auVar124);
    auVar118 = vpackssdw_avx(auVar124._0_16_,auVar124._16_16_);
    auVar90 = vsubps_avx(auVar154,auVar90);
    auVar186 = vsubps_avx(auVar174,auVar69);
    auVar102 = vsubps_avx(auVar142,auVar102);
    auVar120._2_2_ = 0;
    auVar120._0_2_ = uVar3;
    auVar146 = vsqrtps_avx(auVar146);
    auVar120._4_2_ = uVar3;
    auVar120._6_2_ = 0;
    auVar120._8_2_ = uVar3;
    auVar120._10_2_ = 0;
    auVar120._12_2_ = uVar3;
    auVar120._14_2_ = 0;
    auVar120._16_2_ = uVar3;
    auVar120._18_2_ = 0;
    auVar120._20_2_ = uVar3;
    auVar120._22_2_ = 0;
    auVar120._24_2_ = uVar3;
    auVar120._26_2_ = 0;
    auVar120._28_2_ = uVar3;
    auVar120._30_2_ = 0;
    auVar124 = vrcpps_avx(auVar155);
    auVar70._8_4_ = 0x3f800000;
    auVar70._0_8_ = &DAT_3f8000003f800000;
    auVar70._12_4_ = 0x3f800000;
    auVar70._16_4_ = 0x3f800000;
    auVar70._20_4_ = 0x3f800000;
    auVar70._24_4_ = 0x3f800000;
    auVar70._28_4_ = 0x3f800000;
    auVar23 = vfnmadd213ps_fma(auVar124,auVar155,auVar70);
    auVar204._8_4_ = 0x7fffffff;
    auVar204._0_8_ = 0x7fffffff7fffffff;
    auVar204._12_4_ = 0x7fffffff;
    auVar204._16_4_ = 0x7fffffff;
    auVar204._20_4_ = 0x7fffffff;
    auVar204._24_4_ = 0x7fffffff;
    auVar204._28_4_ = 0x7fffffff;
    auVar23 = vfmadd132ps_fma(ZEXT1632(auVar23),auVar124,auVar124);
    auVar124 = vandps_avx(auVar155,auVar204);
    auVar195._8_4_ = 0x219392ef;
    auVar195._0_8_ = 0x219392ef219392ef;
    auVar195._12_4_ = 0x219392ef;
    auVar195._16_4_ = 0x219392ef;
    auVar195._20_4_ = 0x219392ef;
    auVar195._24_4_ = 0x219392ef;
    auVar195._28_4_ = 0x219392ef;
    auVar124 = vcmpps_avx(auVar124,auVar195,2);
    uVar66 = CONCAT44(auVar92._4_4_,auVar92._0_4_);
    auVar196._0_8_ = uVar66 ^ 0x8000000080000000;
    auVar196._8_4_ = -auVar92._8_4_;
    auVar196._12_4_ = -auVar92._12_4_;
    auVar196._16_4_ = -auVar92._16_4_;
    auVar196._20_4_ = -auVar92._20_4_;
    auVar196._24_4_ = -auVar92._24_4_;
    auVar196._28_4_ = -auVar92._28_4_;
    auVar155 = vsubps_avx(auVar196,auVar146);
    auVar69 = vsubps_avx(auVar146,auVar92);
    auVar143._8_4_ = 0xff800000;
    auVar143._0_8_ = 0xff800000ff800000;
    auVar143._12_4_ = 0xff800000;
    auVar143._16_4_ = 0xff800000;
    auVar143._20_4_ = 0xff800000;
    auVar143._24_4_ = 0xff800000;
    auVar143._28_4_ = 0xff800000;
    auVar37._4_4_ = auVar23._4_4_ * auVar155._4_4_;
    auVar37._0_4_ = auVar23._0_4_ * auVar155._0_4_;
    auVar37._8_4_ = auVar23._8_4_ * auVar155._8_4_;
    auVar37._12_4_ = auVar23._12_4_ * auVar155._12_4_;
    auVar37._16_4_ = auVar155._16_4_ * 0.0;
    auVar37._20_4_ = auVar155._20_4_ * 0.0;
    auVar37._24_4_ = auVar155._24_4_ * 0.0;
    auVar37._28_4_ = auVar155._28_4_;
    auVar146 = vblendvps_avx(auVar37,auVar143,auVar124);
    auVar38._4_4_ = auVar23._4_4_ * auVar69._4_4_;
    auVar38._0_4_ = auVar23._0_4_ * auVar69._0_4_;
    auVar38._8_4_ = auVar23._8_4_ * auVar69._8_4_;
    auVar38._12_4_ = auVar23._12_4_ * auVar69._12_4_;
    auVar38._16_4_ = auVar69._16_4_ * 0.0;
    auVar38._20_4_ = auVar69._20_4_ * 0.0;
    auVar38._24_4_ = auVar69._24_4_ * 0.0;
    auVar38._28_4_ = auVar69._28_4_;
    auVar144._8_4_ = 0x7f800000;
    auVar144._0_8_ = 0x7f8000007f800000;
    auVar144._12_4_ = 0x7f800000;
    auVar144._16_4_ = 0x7f800000;
    auVar144._20_4_ = 0x7f800000;
    auVar144._24_4_ = 0x7f800000;
    auVar144._28_4_ = 0x7f800000;
    auVar155 = vblendvps_avx(auVar38,auVar144,auVar124);
    auVar21 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
    auVar124 = vpand_avx2(auVar21,auVar120);
    auVar124 = vpcmpeqd_avx2(auVar124,auVar103);
    auVar23 = vpackssdw_avx(auVar124._0_16_,auVar124._16_16_);
    auVar145._0_4_ = fVar13 + fVar171 * auVar146._0_4_;
    auVar145._4_4_ = fVar81 + fVar176 * auVar146._4_4_;
    auVar145._8_4_ = fVar85 + fVar177 * auVar146._8_4_;
    auVar145._12_4_ = fVar89 + fVar178 * auVar146._12_4_;
    auVar145._16_4_ = auVar146._16_4_ * 0.0 + 0.0;
    auVar145._20_4_ = auVar146._20_4_ * 0.0 + 0.0;
    auVar145._24_4_ = auVar146._24_4_ * 0.0 + 0.0;
    auVar145._28_4_ = 0;
    auVar103 = ZEXT1232(ZEXT412(0)) << 0x20;
    auVar124 = vcmpps_avx(auVar145,auVar103,6);
    auVar69 = vcmpps_avx(auVar145,auVar97,1);
    auVar124 = vandps_avx(auVar69,auVar124);
    auVar25 = vpackssdw_avx(auVar124._0_16_,auVar124._16_16_);
    auVar25 = vpand_avx(auVar118,auVar25);
    auVar119 = vpmovsxwd_avx2(auVar25);
    local_500 = vblendvps_avx(auVar144,auVar146,auVar119);
    auVar71._2_2_ = 0;
    auVar71._0_2_ = uVar2;
    auVar71._4_2_ = uVar2;
    auVar71._6_2_ = 0;
    auVar71._8_2_ = uVar2;
    auVar71._10_2_ = 0;
    auVar71._12_2_ = uVar2;
    auVar71._14_2_ = 0;
    auVar71._16_2_ = uVar2;
    auVar71._18_2_ = 0;
    auVar71._20_2_ = uVar2;
    auVar71._22_2_ = 0;
    auVar71._24_2_ = uVar2;
    auVar71._26_2_ = 0;
    auVar71._28_2_ = uVar2;
    auVar71._30_2_ = 0;
    auVar124 = vpand_avx2(auVar21,auVar71);
    auVar69 = vpcmpeqd_avx2(auVar124,auVar103);
    local_3c0._0_4_ = fVar13 + fVar171 * auVar155._0_4_;
    local_3c0._4_4_ = fVar81 + fVar176 * auVar155._4_4_;
    fStack_3b8 = fVar85 + fVar177 * auVar155._8_4_;
    fStack_3b4 = fVar89 + fVar178 * auVar155._12_4_;
    fStack_3b0 = auVar155._16_4_ * 0.0 + 0.0;
    fStack_3ac = auVar155._20_4_ * 0.0 + 0.0;
    fStack_3a8 = auVar155._24_4_ * 0.0 + 0.0;
    register0x000012dc = auVar119._28_4_ + 0.0;
    auVar124 = vcmpps_avx(_local_3c0,auVar103,6);
    auVar146 = vcmpps_avx(_local_3c0,auVar97,1);
    auVar124 = vandps_avx(auVar146,auVar124);
    auVar25 = vpackssdw_avx(auVar124._0_16_,auVar124._16_16_);
    auVar25 = vpand_avx(auVar118,auVar25);
    auVar124 = vpmovsxwd_avx2(auVar25);
    local_5c0 = vblendvps_avx(auVar143,auVar155,auVar124);
    auVar25 = vpackssdw_avx(auVar69._0_16_,auVar69._16_16_);
    auVar124 = vrcpps_avx(ZEXT1632(auVar24));
    auVar121._8_4_ = 0x3f800000;
    auVar121._0_8_ = &DAT_3f8000003f800000;
    auVar121._12_4_ = 0x3f800000;
    auVar121._16_4_ = 0x3f800000;
    auVar121._20_4_ = 0x3f800000;
    auVar121._24_4_ = 0x3f800000;
    auVar121._28_4_ = 0x3f800000;
    auVar24 = vfnmadd213ps_fma(auVar124,ZEXT1632(auVar24),auVar121);
    auVar22 = vfmadd132ps_fma(ZEXT1632(auVar24),auVar124,auVar124);
    auVar39._4_4_ = fVar176 * (float)local_4a0._4_4_;
    auVar39._0_4_ = fVar171 * (float)local_4a0._0_4_;
    auVar39._8_4_ = fVar177 * fStack_498;
    auVar39._12_4_ = fVar178 * fStack_494;
    auVar39._16_4_ = fStack_490 * 0.0;
    auVar39._20_4_ = fStack_48c * 0.0;
    auVar39._24_4_ = fStack_488 * 0.0;
    auVar39._28_4_ = auVar124._28_4_;
    auVar40._4_4_ = fStack_2c4 * fVar81;
    auVar40._0_4_ = fStack_2c4 * fVar13;
    auVar40._8_4_ = fStack_2c4 * fVar85;
    auVar40._12_4_ = fStack_2c4 * fVar89;
    auVar40._16_4_ = fStack_2c4 * 0.0;
    auVar40._20_4_ = fStack_2c4 * 0.0;
    auVar40._24_4_ = fStack_2c4 * 0.0;
    auVar40._28_4_ = 0x3f800000;
    auVar124 = vsubps_avx(auVar39,auVar40);
    auVar41._4_4_ = fVar176 * (float)local_4c0._4_4_;
    auVar41._0_4_ = fVar171 * (float)local_4c0._0_4_;
    auVar41._8_4_ = fVar177 * fStack_4b8;
    auVar41._12_4_ = fVar178 * fStack_4b4;
    auVar41._16_4_ = fStack_4b0 * 0.0;
    auVar41._20_4_ = fStack_4ac * 0.0;
    auVar41._24_4_ = fStack_4a8 * 0.0;
    auVar41._28_4_ = 0x3f800000;
    auVar205._0_4_ = fVar194 * fVar13;
    auVar205._4_4_ = fVar194 * fVar81;
    auVar205._8_4_ = fVar194 * fVar85;
    auVar205._12_4_ = fVar194 * fVar89;
    auVar205._16_4_ = fVar194 * 0.0;
    auVar205._20_4_ = fVar194 * 0.0;
    auVar205._24_4_ = fVar194 * 0.0;
    auVar205._28_4_ = 0;
    auVar146 = vsubps_avx(auVar41,auVar205);
    auVar42._4_4_ = fVar176 * fVar188;
    auVar42._0_4_ = fVar171 * fVar185;
    auVar42._8_4_ = fVar177 * fVar189;
    auVar42._12_4_ = fVar178 * fVar190;
    auVar42._16_4_ = fVar191 * 0.0;
    auVar42._20_4_ = fVar192 * 0.0;
    auVar42._24_4_ = fVar193 * 0.0;
    auVar42._28_4_ = 0;
    auVar43._4_4_ = fVar81 * local_340;
    auVar43._0_4_ = fVar13 * local_340;
    auVar43._8_4_ = fVar85 * local_340;
    auVar43._12_4_ = fVar89 * local_340;
    auVar43._16_4_ = local_340 * 0.0;
    auVar43._20_4_ = local_340 * 0.0;
    auVar43._24_4_ = local_340 * 0.0;
    auVar43._28_4_ = 0;
    auVar155 = vsubps_avx(auVar42,auVar43);
    auVar44._4_4_ = auVar155._4_4_ * auVar155._4_4_;
    auVar44._0_4_ = auVar155._0_4_ * auVar155._0_4_;
    auVar44._8_4_ = auVar155._8_4_ * auVar155._8_4_;
    auVar44._12_4_ = auVar155._12_4_ * auVar155._12_4_;
    auVar44._16_4_ = auVar155._16_4_ * auVar155._16_4_;
    auVar44._20_4_ = auVar155._20_4_ * auVar155._20_4_;
    auVar44._24_4_ = auVar155._24_4_ * auVar155._24_4_;
    auVar44._28_4_ = auVar155._28_4_;
    auVar24 = vfmadd231ps_fma(auVar44,auVar146,auVar146);
    auVar24 = vfmadd231ps_fma(ZEXT1632(auVar24),auVar124,auVar124);
    auVar45._4_4_ = fVar134 * fVar134 * fVar158;
    auVar45._0_4_ = fVar131 * fVar131 * fVar151;
    auVar45._8_4_ = fVar135 * fVar135 * fVar159;
    auVar45._12_4_ = fVar136 * fVar136 * fVar160;
    auVar45._16_4_ = fVar137 * fVar137 * 0.0;
    auVar45._20_4_ = fVar138 * fVar138 * 0.0;
    auVar45._24_4_ = fVar139 * fVar139 * 0.0;
    auVar45._28_4_ = fVar114;
    auVar124 = vcmpps_avx(ZEXT1632(auVar24),auVar45,1);
    auVar24 = vpackssdw_avx(auVar124._0_16_,auVar124._16_16_);
    auVar24 = vpand_avx(auVar25,auVar24);
    auVar46._4_4_ = auVar22._4_4_ * -fVar81;
    auVar46._0_4_ = auVar22._0_4_ * -fVar13;
    auVar46._8_4_ = auVar22._8_4_ * -fVar85;
    auVar46._12_4_ = auVar22._12_4_ * -fVar89;
    auVar46._16_4_ = 0x80000000;
    auVar46._20_4_ = 0x80000000;
    auVar46._24_4_ = 0x80000000;
    auVar46._28_4_ = 0x80000000;
    auVar24 = vpand_avx(auVar118,auVar24);
    auVar124 = vpmovsxwd_avx2(auVar24);
    auVar122._8_4_ = 0x7f800000;
    auVar122._0_8_ = 0x7f8000007f800000;
    auVar122._12_4_ = 0x7f800000;
    auVar122._16_4_ = 0x7f800000;
    auVar122._20_4_ = 0x7f800000;
    auVar122._24_4_ = 0x7f800000;
    auVar122._28_4_ = 0x7f800000;
    local_620 = vblendvps_avx(auVar122,auVar46,auVar124);
    local_600._0_4_ = auVar102._0_4_;
    local_600._4_4_ = auVar102._4_4_;
    fStack_5f8 = auVar102._8_4_;
    fStack_5f4 = auVar102._12_4_;
    fStack_5f0 = auVar102._16_4_;
    fStack_5ec = auVar102._20_4_;
    fStack_5e8 = auVar102._24_4_;
    uStack_5e4 = auVar102._28_4_;
    auVar47._4_4_ = (float)local_600._4_4_ * fVar14;
    auVar47._0_4_ = (float)local_600._0_4_ * fVar202;
    auVar47._8_4_ = fStack_5f8 * fVar16;
    auVar47._12_4_ = fStack_5f4 * fVar17;
    auVar47._16_4_ = fStack_5f0 * fVar18;
    auVar47._20_4_ = fStack_5ec * fVar19;
    auVar47._24_4_ = fStack_5e8 * fVar20;
    auVar47._28_4_ = 0x80000000;
    auVar24 = vfmadd231ps_fma(auVar47,auVar186,local_640);
    auVar24 = vfmadd231ps_fma(ZEXT1632(auVar24),auVar90,local_4e0);
    auVar48._4_4_ = fVar176 * auVar90._4_4_;
    auVar48._0_4_ = fVar171 * auVar90._0_4_;
    auVar48._8_4_ = fVar177 * auVar90._8_4_;
    auVar48._12_4_ = fVar178 * auVar90._12_4_;
    auVar48._16_4_ = auVar90._16_4_ * 0.0;
    auVar48._20_4_ = auVar90._20_4_ * 0.0;
    auVar48._24_4_ = auVar90._24_4_ * 0.0;
    auVar48._28_4_ = auVar90._28_4_;
    auVar49._4_4_ = fVar176 * auVar186._4_4_;
    auVar49._0_4_ = fVar171 * auVar186._0_4_;
    auVar49._8_4_ = fVar177 * auVar186._8_4_;
    auVar49._12_4_ = fVar178 * auVar186._12_4_;
    auVar49._16_4_ = auVar186._16_4_ * 0.0;
    auVar49._20_4_ = auVar186._20_4_ * 0.0;
    auVar49._24_4_ = auVar186._24_4_ * 0.0;
    auVar49._28_4_ = auVar186._28_4_;
    auVar50._4_4_ = fVar176 * (float)local_600._4_4_;
    auVar50._0_4_ = fVar171 * (float)local_600._0_4_;
    auVar50._8_4_ = fVar177 * fStack_5f8;
    auVar50._12_4_ = fVar178 * fStack_5f4;
    auVar50._16_4_ = fStack_5f0 * 0.0;
    auVar50._20_4_ = fStack_5ec * 0.0;
    auVar50._24_4_ = fStack_5e8 * 0.0;
    auVar50._28_4_ = uStack_5e4;
    fVar13 = auVar24._0_4_;
    fVar81 = auVar24._4_4_;
    auVar51._4_4_ = fStack_2c4 * fVar81;
    auVar51._0_4_ = fStack_2c4 * fVar13;
    fVar85 = auVar24._8_4_;
    auVar51._8_4_ = fStack_2c4 * fVar85;
    fVar89 = auVar24._12_4_;
    auVar51._12_4_ = fStack_2c4 * fVar89;
    auVar51._16_4_ = fStack_2c4 * 0.0;
    auVar51._20_4_ = fStack_2c4 * 0.0;
    auVar51._24_4_ = fStack_2c4 * 0.0;
    auVar51._28_4_ = fVar33;
    auVar124 = vsubps_avx(auVar48,auVar51);
    auVar52._4_4_ = fVar194 * fVar81;
    auVar52._0_4_ = fVar194 * fVar13;
    auVar52._8_4_ = fVar194 * fVar85;
    auVar52._12_4_ = fVar194 * fVar89;
    auVar52._16_4_ = fVar194 * 0.0;
    auVar52._20_4_ = fVar194 * 0.0;
    auVar52._24_4_ = fVar194 * 0.0;
    auVar52._28_4_ = fVar33;
    auVar146 = vsubps_avx(auVar49,auVar52);
    auVar53._4_4_ = local_340 * fVar81;
    auVar53._0_4_ = local_340 * fVar13;
    auVar53._8_4_ = local_340 * fVar85;
    auVar53._12_4_ = local_340 * fVar89;
    auVar53._16_4_ = local_340 * 0.0;
    auVar53._20_4_ = local_340 * 0.0;
    auVar53._24_4_ = local_340 * 0.0;
    auVar53._28_4_ = fVar33;
    auVar155 = vsubps_avx(auVar50,auVar53);
    auVar54._4_4_ = auVar155._4_4_ * auVar155._4_4_;
    auVar54._0_4_ = auVar155._0_4_ * auVar155._0_4_;
    auVar54._8_4_ = auVar155._8_4_ * auVar155._8_4_;
    auVar54._12_4_ = auVar155._12_4_ * auVar155._12_4_;
    auVar54._16_4_ = auVar155._16_4_ * auVar155._16_4_;
    auVar54._20_4_ = auVar155._20_4_ * auVar155._20_4_;
    auVar54._24_4_ = auVar155._24_4_ * auVar155._24_4_;
    auVar54._28_4_ = auVar155._28_4_;
    auVar24 = vfmadd231ps_fma(auVar54,auVar146,auVar146);
    auVar24 = vfmadd231ps_fma(ZEXT1632(auVar24),auVar124,auVar124);
    local_5e0._0_4_ = auVar167._0_4_;
    local_5e0._4_4_ = auVar167._4_4_;
    fStack_5d8 = auVar167._8_4_;
    fStack_5d4 = auVar167._12_4_;
    fStack_5d0 = auVar167._16_4_;
    fStack_5cc = auVar167._20_4_;
    fStack_5c8 = auVar167._24_4_;
    auVar167._4_4_ = fVar158 * (float)local_5e0._4_4_ * (float)local_5e0._4_4_;
    auVar167._0_4_ = fVar151 * (float)local_5e0._0_4_ * (float)local_5e0._0_4_;
    auVar167._8_4_ = fVar159 * fStack_5d8 * fStack_5d8;
    auVar167._12_4_ = fVar160 * fStack_5d4 * fStack_5d4;
    auVar167._16_4_ = fStack_5d0 * fStack_5d0 * 0.0;
    auVar167._20_4_ = fStack_5cc * fStack_5cc * 0.0;
    auVar167._24_4_ = fStack_5c8 * fStack_5c8 * 0.0;
    auVar167._28_4_ = auVar146._28_4_;
    auVar183._8_4_ = 0x7f800000;
    auVar183._0_8_ = 0x7f8000007f800000;
    auVar183._12_4_ = 0x7f800000;
    auVar183._16_4_ = 0x7f800000;
    auVar183._20_4_ = 0x7f800000;
    auVar183._24_4_ = 0x7f800000;
    auVar183._28_4_ = 0x7f800000;
    uVar67 = *(undefined4 *)(ray + k * 4 + 0x60);
    auVar72._4_4_ = uVar67;
    auVar72._0_4_ = uVar67;
    auVar72._8_4_ = uVar67;
    auVar72._12_4_ = uVar67;
    auVar72._16_4_ = uVar67;
    auVar72._20_4_ = uVar67;
    auVar72._24_4_ = uVar67;
    auVar72._28_4_ = uVar67;
    auVar124 = vcmpps_avx(ZEXT1632(auVar24),auVar167,1);
    auVar24 = vpackssdw_avx(auVar124._0_16_,auVar124._16_16_);
    auVar23 = vpand_avx(auVar24,auVar23);
    auVar93._0_4_ = auVar22._0_4_ * -fVar13;
    auVar93._4_4_ = auVar22._4_4_ * -fVar81;
    auVar93._8_4_ = auVar22._8_4_ * -fVar85;
    auVar93._12_4_ = auVar22._12_4_ * -fVar89;
    auVar93._16_4_ = 0x80000000;
    auVar93._20_4_ = 0x80000000;
    auVar93._24_4_ = 0x80000000;
    auVar93._28_4_ = 0;
    auVar23 = vpand_avx(auVar118,auVar23);
    auVar124 = vpmovsxwd_avx2(auVar23);
    auVar124 = vblendvps_avx(auVar183,auVar93,auVar124);
    auVar69 = vminps_avx(local_620,auVar124);
    auVar146 = vmaxps_avx(local_620,auVar124);
    auVar167 = vminps_avx(local_500,auVar69);
    auVar155 = vcmpps_avx(auVar167,auVar69,0);
    auVar124 = vcmpps_avx(auVar183,auVar146,0);
    auVar162._8_4_ = 0xff800000;
    auVar162._0_8_ = 0xff800000ff800000;
    auVar162._12_4_ = 0xff800000;
    auVar162._16_4_ = 0xff800000;
    auVar162._20_4_ = 0xff800000;
    auVar162._24_4_ = 0xff800000;
    auVar162._28_4_ = 0xff800000;
    auVar124 = vblendvps_avx(auVar146,auVar162,auVar124);
    auVar146 = vcmpps_avx(auVar183,auVar69,0);
    auVar146 = vblendvps_avx(auVar69,auVar162,auVar146);
    auVar124 = vblendvps_avx(auVar146,auVar124,auVar155);
    local_80 = vmaxps_avx(local_5c0,auVar124);
    auVar104._0_4_ = fVar140 + auVar167._0_4_;
    auVar104._4_4_ = fVar148 + auVar167._4_4_;
    auVar104._8_4_ = fVar149 + auVar167._8_4_;
    auVar104._12_4_ = fVar150 + auVar167._12_4_;
    auVar104._16_4_ = auVar167._16_4_ + 0.0;
    auVar104._20_4_ = auVar167._20_4_ + 0.0;
    auVar104._24_4_ = auVar167._24_4_ + 0.0;
    auVar104._28_4_ = fStack_a4 + auVar167._28_4_;
    uVar67 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar123._4_4_ = uVar67;
    auVar123._0_4_ = uVar67;
    auVar123._8_4_ = uVar67;
    auVar123._12_4_ = uVar67;
    auVar123._16_4_ = uVar67;
    auVar123._20_4_ = uVar67;
    auVar123._24_4_ = uVar67;
    auVar123._28_4_ = uVar67;
    auVar124 = vcmpps_avx(auVar72,auVar104,2);
    auVar146 = vcmpps_avx(auVar104,auVar123,2);
    auVar124 = vandps_avx(auVar124,auVar146);
    auVar146 = vcmpps_avx(auVar183,auVar167,4);
    auVar124 = vandps_avx(auVar124,auVar146);
    auVar23 = vpackssdw_avx(auVar124._0_16_,auVar124._16_16_);
    local_520 = vpand_avx(auVar118,auVar23);
    local_5e0._0_4_ = local_80._0_4_ + fVar140;
    local_5e0._4_4_ = local_80._4_4_ + fVar148;
    fStack_5d8 = local_80._8_4_ + fVar149;
    fStack_5d4 = local_80._12_4_ + fVar150;
    fStack_5d0 = local_80._16_4_ + 0.0;
    fStack_5cc = local_80._20_4_ + 0.0;
    fStack_5c8 = local_80._24_4_ + 0.0;
    register0x0000129c = local_80._28_4_ + fStack_a4;
    auVar124 = vcmpps_avx(auVar72,_local_5e0,2);
    auVar146 = vcmpps_avx(_local_5e0,auVar123,2);
    auVar124 = vandps_avx(auVar124,auVar146);
    auVar146 = vcmpps_avx(local_80,auVar162,4);
    auVar124 = vandps_avx(auVar124,auVar146);
    auVar23 = vpackssdw_avx(auVar124._0_16_,auVar124._16_16_);
    local_540 = vpand_avx(auVar118,auVar23);
    auVar23 = vpor_avx(local_520,local_540);
    local_6a0 = vpmovsxwd_avx2(auVar23);
    if ((((((((local_6a0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (local_6a0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_6a0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(local_6a0 >> 0x7f,0) != '\0') ||
          (local_6a0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(local_6a0 >> 0xbf,0) != '\0') ||
        (local_6a0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_6a0[0x1f] < '\0') {
      auStack_530 = auVar186._16_16_;
      auStack_510 = auVar90._16_16_;
      auVar124 = vpmovzxwd_avx2(local_520);
      local_5a0._0_16_ = auVar23;
      auVar124 = vpslld_avx2(auVar124,0x1f);
      auVar146 = vblendvps_avx(local_80,auVar167,auVar124);
      auVar155 = vblendvps_avx(_local_3c0,auVar145,auVar124);
      auVar167 = vrcpps_avx(auVar97);
      auVar94._8_4_ = 0x3f800000;
      auVar94._0_8_ = &DAT_3f8000003f800000;
      auVar94._12_4_ = 0x3f800000;
      auVar94._16_4_ = 0x3f800000;
      auVar94._20_4_ = 0x3f800000;
      auVar94._24_4_ = 0x3f800000;
      auVar94._28_4_ = 0x3f800000;
      auVar25 = vfnmadd213ps_fma(auVar167,auVar97,auVar94);
      fVar131 = fVar198 * fVar203 * fVar131;
      fVar134 = fVar199 * fVar15 * fVar134;
      fVar135 = fVar200 * fVar83 * fVar135;
      fVar136 = fVar201 * fVar87 * fVar136;
      fVar137 = fVar101 * 0.0 * fVar137;
      fVar138 = fVar108 * 0.0 * fVar138;
      fVar139 = fVar110 * 0.0 * fVar139;
      local_2e0 = local_4e0._0_4_ * fVar131;
      fStack_2dc = local_4e0._4_4_ * fVar134;
      fVar81 = local_4e0._8_4_;
      fVar83 = local_4e0._12_4_;
      fVar85 = local_4e0._16_4_;
      fVar87 = local_4e0._20_4_;
      fVar89 = local_4e0._24_4_;
      local_300 = local_4e0._0_4_ * fVar68;
      fStack_2fc = local_4e0._4_4_ * fVar79;
      auVar124 = vcmpps_avx(auVar146,local_500,0);
      auVar69 = vcmpps_avx(auVar146,local_5c0,0);
      auVar124 = vorps_avx(auVar124,auVar69);
      auVar24 = vpackssdw_avx(auVar124._0_16_,auVar124._16_16_);
      auVar24 = vpand_avx(auVar118,auVar24);
      auVar90 = vpmovsxwd_avx2(auVar24);
      auVar124 = vcmpps_avx(local_620,auVar146,0);
      auVar24 = vpackssdw_avx(auVar124._0_16_,auVar124._16_16_);
      auVar118 = vpand_avx(auVar118,auVar24);
      auVar102 = vpmovsxwd_avx2(auVar118);
      fVar101 = auVar146._0_4_;
      fVar108 = auVar146._4_4_;
      fVar110 = auVar146._8_4_;
      fVar112 = auVar146._12_4_;
      fVar114 = auVar146._16_4_;
      fVar100 = auVar146._20_4_;
      fVar107 = auVar146._24_4_;
      fStack_2d8 = fVar81 * fVar135;
      fStack_2d4 = fVar83 * fVar136;
      fStack_2d0 = fVar85 * fVar137;
      fStack_2cc = fVar87 * fVar138;
      fStack_2c8 = fVar89 * fVar139;
      auVar125._0_4_ = local_2e0 + fVar117 * (fVar101 * fStack_2c4 + (float)local_4a0._0_4_);
      auVar125._4_4_ = fStack_2dc + fVar128 * (fVar108 * fStack_2c4 + (float)local_4a0._4_4_);
      auVar125._8_4_ = fVar81 * fVar135 + fVar129 * (fVar110 * fStack_2c4 + fStack_498);
      auVar125._12_4_ = fVar83 * fVar136 + fVar130 * (fVar112 * fStack_2c4 + fStack_494);
      auVar125._16_4_ = fVar85 * fVar137 + (fVar114 * fStack_2c4 + fStack_490) * 0.0;
      auVar125._20_4_ = fVar87 * fVar138 + (fVar100 * fStack_2c4 + fStack_48c) * 0.0;
      auVar125._24_4_ = fVar89 * fVar139 + (fVar107 * fStack_2c4 + fStack_488) * 0.0;
      auVar125._28_4_ = fStack_2c4 + fStack_484 + 0.0;
      fStack_2f8 = fVar81 * fVar80;
      fStack_2f4 = fVar83 * fVar82;
      fStack_2f0 = fVar85 * fVar84;
      fStack_2ec = fVar87 * fVar86;
      fStack_2e8 = fVar89 * fVar88;
      uStack_2e4 = 0x80000000;
      fVar198 = auVar155._0_4_;
      auVar180._0_4_ = local_300 * fVar198;
      fVar199 = auVar155._4_4_;
      auVar180._4_4_ = fStack_2fc * fVar199;
      fVar200 = auVar155._8_4_;
      auVar180._8_4_ = fVar81 * fVar80 * fVar200;
      fVar201 = auVar155._12_4_;
      auVar180._12_4_ = fVar83 * fVar82 * fVar201;
      fVar203 = auVar155._16_4_;
      auVar180._16_4_ = fVar85 * fVar84 * fVar203;
      fVar13 = auVar155._20_4_;
      auVar180._20_4_ = fVar87 * fVar86 * fVar13;
      fVar15 = auVar155._24_4_;
      auVar180._24_4_ = fVar89 * fVar88 * fVar15;
      auVar180._28_4_ = 0;
      auVar69 = vsubps_avx(auVar125,auVar180);
      local_e0._0_8_ = local_4e0._0_8_ ^ 0x8000000080000000;
      local_e0._8_4_ = -fVar81;
      local_e0._12_4_ = -fVar83;
      local_e0._16_4_ = -fVar85;
      local_e0._20_4_ = -fVar87;
      local_e0._24_4_ = -fVar89;
      local_e0._28_4_ = -fVar28;
      auVar124 = vblendvps_avx(local_4e0,local_e0,auVar102);
      local_420 = vblendvps_avx(auVar124,auVar69,auVar90);
      auVar118 = vfmadd132ps_fma(ZEXT1632(auVar25),auVar167,auVar167);
      local_c0 = local_640._0_4_ * fVar131;
      fStack_bc = local_640._4_4_ * fVar134;
      fVar81 = local_640._8_4_;
      fVar83 = local_640._12_4_;
      fVar85 = local_640._16_4_;
      fVar87 = local_640._20_4_;
      fVar89 = local_640._24_4_;
      fStack_b8 = fVar81 * fVar135;
      fStack_b4 = fVar83 * fVar136;
      fStack_b0 = fVar85 * fVar137;
      fStack_ac = fVar87 * fVar138;
      fStack_a8 = fVar89 * fVar139;
      auVar126._0_4_ = local_c0 + fVar117 * (fVar194 * fVar101 + (float)local_4c0._0_4_);
      auVar126._4_4_ = fStack_bc + fVar128 * (fVar194 * fVar108 + (float)local_4c0._4_4_);
      auVar126._8_4_ = fVar81 * fVar135 + fVar129 * (fVar194 * fVar110 + fStack_4b8);
      auVar126._12_4_ = fVar83 * fVar136 + fVar130 * (fVar194 * fVar112 + fStack_4b4);
      auVar126._16_4_ = fVar85 * fVar137 + (fVar194 * fVar114 + fStack_4b0) * 0.0;
      auVar126._20_4_ = fVar87 * fVar138 + (fVar194 * fVar100 + fStack_4ac) * 0.0;
      auVar126._24_4_ = fVar89 * fVar139 + (fVar194 * fVar107 + fStack_4a8) * 0.0;
      auVar126._28_4_ = fStack_a4 + auVar69._28_4_ + fVar33;
      local_a0 = local_640._0_4_ * fVar68;
      fStack_9c = local_640._4_4_ * fVar79;
      fStack_98 = fVar81 * fVar80;
      fStack_94 = fVar83 * fVar82;
      fStack_90 = fVar85 * fVar84;
      fStack_8c = fVar87 * fVar86;
      fStack_88 = fVar89 * fVar88;
      fStack_84 = fStack_a4;
      auVar55._4_4_ = fStack_9c * fVar199;
      auVar55._0_4_ = local_a0 * fVar198;
      auVar55._8_4_ = fVar81 * fVar80 * fVar200;
      auVar55._12_4_ = fVar83 * fVar82 * fVar201;
      auVar55._16_4_ = fVar85 * fVar84 * fVar203;
      auVar55._20_4_ = fVar87 * fVar86 * fVar13;
      auVar55._24_4_ = fVar89 * fVar88 * fVar15;
      auVar55._28_4_ = auVar167._28_4_;
      auVar69 = vsubps_avx(auVar126,auVar55);
      local_120._0_8_ = local_640._0_8_ ^ 0x8000000080000000;
      local_120._8_4_ = -fVar81;
      local_120._12_4_ = -fVar83;
      local_120._16_4_ = -fVar85;
      local_120._20_4_ = -fVar87;
      local_120._24_4_ = -fVar89;
      local_120._28_4_ = local_640._28_4_ ^ 0x80000000;
      auVar124 = vblendvps_avx(local_640,local_120,auVar102);
      local_400 = vblendvps_avx(auVar124,auVar69,auVar90);
      auVar187 = ZEXT3264(local_380);
      local_100 = fVar202 * fVar131;
      fStack_fc = fVar14 * fVar134;
      fStack_f8 = fVar16 * fVar135;
      fStack_f4 = fVar17 * fVar136;
      fStack_f0 = fVar18 * fVar137;
      fStack_ec = fVar19 * fVar138;
      fStack_e8 = fVar20 * fVar139;
      fStack_e4 = auVar124._28_4_;
      auVar132._0_4_ = fVar202 * fVar131 + fVar117 * (fVar185 + local_340 * fVar101);
      auVar132._4_4_ = fVar14 * fVar134 + fVar128 * (fVar188 + local_340 * fVar108);
      auVar132._8_4_ = fVar16 * fVar135 + fVar129 * (fVar189 + local_340 * fVar110);
      auVar132._12_4_ = fVar17 * fVar136 + fVar130 * (fVar190 + local_340 * fVar112);
      auVar132._16_4_ = fVar18 * fVar137 + (fVar191 + local_340 * fVar114) * 0.0;
      auVar132._20_4_ = fVar19 * fVar138 + (fVar192 + local_340 * fVar100) * 0.0;
      auVar132._24_4_ = fVar20 * fVar139 + (fVar193 + local_340 * fVar107) * 0.0;
      auVar132._28_4_ = auVar124._28_4_ + local_360._28_4_ + 0.0;
      local_140._0_8_ = local_380._0_8_ ^ 0x8000000080000000;
      local_140._8_4_ = -fVar16;
      local_140._12_4_ = -fVar17;
      local_140._16_4_ = -fVar18;
      local_140._20_4_ = -fVar19;
      local_140._24_4_ = -fVar20;
      local_140._28_4_ = local_380._28_4_ ^ 0x80000000;
      local_2c0 = fVar202 * fVar68;
      fStack_2bc = fVar14 * fVar79;
      fStack_2b8 = fVar16 * fVar80;
      fStack_2b4 = fVar17 * fVar82;
      fStack_2b0 = fVar18 * fVar84;
      fStack_2ac = fVar19 * fVar86;
      fStack_2a8 = fVar20 * fVar88;
      fStack_2a4 = fVar28 + 0.0;
      auVar56._4_4_ = fVar14 * fVar79 * fVar199;
      auVar56._0_4_ = fVar202 * fVar68 * fVar198;
      auVar56._8_4_ = fVar16 * fVar80 * fVar200;
      auVar56._12_4_ = fVar17 * fVar82 * fVar201;
      auVar56._16_4_ = fVar18 * fVar84 * fVar203;
      auVar56._20_4_ = fVar19 * fVar86 * fVar13;
      auVar56._24_4_ = fVar20 * fVar88 * fVar15;
      auVar56._28_4_ = fVar28 + 0.0;
      auVar124 = vblendvps_avx(local_380,local_140,auVar102);
      auVar69 = vsubps_avx(auVar132,auVar56);
      local_3e0 = vblendvps_avx(auVar124,auVar69,auVar90);
      auVar95._8_4_ = 0x3f800000;
      auVar95._0_8_ = &DAT_3f8000003f800000;
      auVar95._12_4_ = 0x3f800000;
      auVar95._16_4_ = 0x3f800000;
      auVar95._20_4_ = 0x3f800000;
      auVar95._24_4_ = 0x3f800000;
      auVar95._28_4_ = 0x3f800000;
      auVar124 = vandnps_avx(auVar102,auVar95);
      _local_600 = ZEXT1632(auVar118);
      auVar57._4_4_ = auVar118._4_4_ * fVar199;
      auVar57._0_4_ = auVar118._0_4_ * fVar198;
      auVar57._8_4_ = auVar118._8_4_ * fVar200;
      auVar57._12_4_ = auVar118._12_4_ * fVar201;
      auVar57._16_4_ = fVar203 * 0.0;
      auVar57._20_4_ = fVar13 * 0.0;
      auVar57._24_4_ = fVar15 * 0.0;
      auVar57._28_4_ = auVar155._28_4_;
      auVar206 = ZEXT3264(auVar124);
      local_480 = vblendvps_avx(auVar124,auVar57,auVar90);
      local_440._0_4_ = fVar101 + fVar140;
      local_440._4_4_ = fVar108 + fVar148;
      local_440._8_4_ = fVar110 + fVar149;
      local_440._12_4_ = fVar112 + fVar150;
      local_440._16_4_ = fVar114 + 0.0;
      local_440._20_4_ = fVar100 + 0.0;
      local_440._24_4_ = fVar107 + 0.0;
      local_440._28_4_ = auVar146._28_4_ + fStack_a4;
      auVar182 = ZEXT3264(local_440);
      local_460 = ZEXT832(0) << 0x20;
      auVar124 = vpmovzxwd_avx2(auVar23);
      auVar124 = vpslld_avx2(auVar124,0x1f);
      auVar105._8_4_ = 0x7f800000;
      auVar105._0_8_ = 0x7f8000007f800000;
      auVar105._12_4_ = 0x7f800000;
      auVar105._16_4_ = 0x7f800000;
      auVar105._20_4_ = 0x7f800000;
      auVar105._24_4_ = 0x7f800000;
      auVar105._28_4_ = 0x7f800000;
      auVar124 = vblendvps_avx(auVar105,local_440,auVar124);
      auVar146 = vshufps_avx(auVar124,auVar124,0xb1);
      auVar146 = vminps_avx(auVar124,auVar146);
      auVar155 = vshufpd_avx(auVar146,auVar146,5);
      auVar146 = vminps_avx(auVar146,auVar155);
      auVar155 = vpermpd_avx2(auVar146,0x4e);
      auVar146 = vminps_avx(auVar146,auVar155);
      auVar146 = vcmpps_avx(auVar124,auVar146,0);
      auVar155 = local_6a0 & auVar146;
      auVar164 = ZEXT3264(local_660);
      auVar175 = ZEXT3264(local_320);
      auVar169 = ZEXT3264(CONCAT428(local_340,
                                    CONCAT424(local_340,
                                              CONCAT420(local_340,
                                                        CONCAT416(local_340,
                                                                  CONCAT412(local_340,
                                                                            CONCAT48(local_340,
                                                                                     CONCAT44(
                                                  local_340,local_340))))))));
      auVar181 = ZEXT3264(_local_4a0);
      auVar184 = ZEXT3264(_local_4c0);
      auVar197 = ZEXT3264(local_360);
      auVar147 = ZEXT3264(local_4e0);
      auVar124 = local_6a0;
      if ((((((((auVar155 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar155 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar155 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar155 >> 0x7f,0) != '\0') ||
            (auVar155 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar155 >> 0xbf,0) != '\0') ||
          (auVar155 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar155[0x1f] < '\0') {
        auVar124 = vandps_avx(auVar146,local_6a0);
      }
      uVar62 = vmovmskps_avx(auVar124);
      uVar63 = 0;
      for (; (uVar62 & 1) == 0; uVar62 = uVar62 >> 1 | 0x80000000) {
        uVar63 = uVar63 + 1;
      }
      iVar64 = 1 << ((uint)k & 0x1f);
      auVar73._4_4_ = iVar64;
      auVar73._0_4_ = iVar64;
      auVar73._8_4_ = iVar64;
      auVar73._12_4_ = iVar64;
      auVar73._16_4_ = iVar64;
      auVar73._20_4_ = iVar64;
      auVar73._24_4_ = iVar64;
      auVar73._28_4_ = iVar64;
      auVar146 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
      auVar124 = vpand_avx2(auVar73,auVar146);
      local_3a0 = vpcmpeqd_avx2(auVar124,auVar146);
      auVar133 = ZEXT3264(local_640);
      auVar157 = ZEXT3264(local_5c0);
      local_580 = local_6a0;
      do {
        auVar167 = auVar169._0_32_;
        auVar69 = auVar164._0_32_;
        local_6d0.hit = (RTCHitN *)local_2a0;
        local_6d0.valid = (int *)local_680;
        auVar103 = auVar206._0_32_;
        auVar102 = auVar184._0_32_;
        auVar90 = auVar181._0_32_;
        auVar172 = auVar175._0_28_;
        auVar155 = auVar157._0_32_;
        auVar186 = auVar187._0_32_;
        auVar124 = auVar133._0_32_;
        auVar146 = auVar147._0_32_;
        auVar119 = auVar197._0_32_;
        uVar66 = (ulong)uVar63;
        uVar63 = local_160[uVar66];
        pGVar10 = (pSVar65->geometries).items[uVar63].ptr;
        local_6d0.ray = (RTCRayN *)ray;
        if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
          *(undefined4 *)(local_6a0 + uVar66 * 4) = 0;
        }
        else {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
            uVar67 = *(undefined4 *)(local_480 + uVar66 * 4);
            uVar1 = *(undefined4 *)(local_460 + uVar66 * 4);
            *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_440 + uVar66 * 4);
            *(undefined4 *)(ray + k * 4 + 0x180) = *(undefined4 *)(local_420 + uVar66 * 4);
            *(undefined4 *)(ray + k * 4 + 0x1a0) = *(undefined4 *)(local_400 + uVar66 * 4);
            *(undefined4 *)(ray + k * 4 + 0x1c0) = *(undefined4 *)(local_3e0 + uVar66 * 4);
            *(undefined4 *)(ray + k * 4 + 0x1e0) = uVar67;
            *(undefined4 *)(ray + k * 4 + 0x200) = uVar1;
            *(uint *)(ray + k * 4 + 0x220) = (line->primIDs).field_0.i[uVar66];
            *(uint *)(ray + k * 4 + 0x240) = uVar63;
            *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
            *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
LAB_018005cd:
            uVar67 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar75._4_4_ = uVar67;
            auVar75._0_4_ = uVar67;
            auVar75._8_4_ = uVar67;
            auVar75._12_4_ = uVar67;
            auVar75._16_4_ = uVar67;
            auVar75._20_4_ = uVar67;
            auVar75._24_4_ = uVar67;
            auVar75._28_4_ = uVar67;
            auVar23 = vpand_avx(local_540,local_520);
            auVar97 = vcmpps_avx(_local_5e0,auVar75,2);
            auVar118 = vpackssdw_avx(auVar97._0_16_,auVar97._16_16_);
            auVar118 = vpand_avx(auVar118,auVar23);
            auVar97 = vpmovzxwd_avx2(auVar118);
            auVar97 = vpslld_avx2(auVar97,0x1f);
            if ((((((((auVar97 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar97 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar97 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar97 >> 0x7f,0) == '\0') &&
                  (auVar97 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar97 >> 0xbf,0) == '\0') &&
                (auVar97 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar97[0x1f]) {
              return;
            }
            auVar21 = vcmpps_avx(local_80,local_620,0);
            auVar146 = vblendvps_avx(auVar146,local_e0,auVar21);
            auVar124 = vblendvps_avx(auVar124,local_120,auVar21);
            auVar186 = vblendvps_avx(auVar186,local_140,auVar21);
            auVar21 = vcmpps_avx(local_80,local_500,0);
            auVar155 = vcmpps_avx(local_80,auVar155,0);
            auVar21 = vorps_avx(auVar21,auVar155);
            fVar194 = local_80._0_4_;
            fVar198 = local_80._4_4_;
            fVar199 = local_80._8_4_;
            fVar200 = local_80._12_4_;
            fVar201 = local_80._16_4_;
            fVar202 = local_80._20_4_;
            fVar203 = local_80._24_4_;
            auVar156._0_4_ =
                 (float)local_180._0_4_ * (auVar90._0_4_ + fVar194 * auVar69._0_4_) + local_2e0;
            auVar156._4_4_ =
                 (float)local_180._4_4_ * (auVar90._4_4_ + fVar198 * auVar69._4_4_) + fStack_2dc;
            auVar156._8_4_ = fStack_178 * (auVar90._8_4_ + fVar199 * auVar69._8_4_) + fStack_2d8;
            auVar156._12_4_ = fStack_174 * (auVar90._12_4_ + fVar200 * auVar69._12_4_) + fStack_2d4;
            auVar156._16_4_ = fStack_170 * (auVar90._16_4_ + fVar201 * auVar69._16_4_) + fStack_2d0;
            auVar156._20_4_ = fStack_16c * (auVar90._20_4_ + fVar202 * auVar69._20_4_) + fStack_2cc;
            auVar156._24_4_ = fStack_168 * (auVar90._24_4_ + fVar203 * auVar69._24_4_) + fStack_2c8;
            auVar156._28_4_ = auVar90._28_4_ + auVar155._28_4_ + fStack_2c4;
            auVar163._0_4_ =
                 (float)local_180._0_4_ * (auVar102._0_4_ + auVar172._0_4_ * fVar194) + local_c0;
            auVar163._4_4_ =
                 (float)local_180._4_4_ * (auVar102._4_4_ + auVar172._4_4_ * fVar198) + fStack_bc;
            auVar163._8_4_ = fStack_178 * (auVar102._8_4_ + auVar172._8_4_ * fVar199) + fStack_b8;
            auVar163._12_4_ = fStack_174 * (auVar102._12_4_ + auVar172._12_4_ * fVar200) + fStack_b4
            ;
            auVar163._16_4_ = fStack_170 * (auVar102._16_4_ + auVar172._16_4_ * fVar201) + fStack_b0
            ;
            auVar163._20_4_ = fStack_16c * (auVar102._20_4_ + auVar172._20_4_ * fVar202) + fStack_ac
            ;
            auVar163._24_4_ = fStack_168 * (auVar102._24_4_ + auVar172._24_4_ * fVar203) + fStack_a8
            ;
            auVar163._28_4_ = auVar102._28_4_ + auVar69._28_4_ + fStack_a4;
            auVar168._0_4_ =
                 (float)local_180._0_4_ * (auVar119._0_4_ + auVar167._0_4_ * fVar194) + local_100;
            auVar168._4_4_ =
                 (float)local_180._4_4_ * (auVar119._4_4_ + auVar167._4_4_ * fVar198) + fStack_fc;
            auVar168._8_4_ = fStack_178 * (auVar119._8_4_ + auVar167._8_4_ * fVar199) + fStack_f8;
            auVar168._12_4_ = fStack_174 * (auVar119._12_4_ + auVar167._12_4_ * fVar200) + fStack_f4
            ;
            auVar168._16_4_ = fStack_170 * (auVar119._16_4_ + auVar167._16_4_ * fVar201) + fStack_f0
            ;
            auVar168._20_4_ = fStack_16c * (auVar119._20_4_ + auVar167._20_4_ * fVar202) + fStack_ec
            ;
            auVar168._24_4_ = fStack_168 * (auVar119._24_4_ + auVar167._24_4_ * fVar203) + fStack_e8
            ;
            auVar168._28_4_ = auVar119._28_4_ + auVar167._28_4_ + fStack_e4;
            auVar58._4_4_ = (float)local_3c0._4_4_ * fStack_2fc;
            auVar58._0_4_ = (float)local_3c0._0_4_ * local_300;
            auVar58._8_4_ = fStack_3b8 * fStack_2f8;
            auVar58._12_4_ = fStack_3b4 * fStack_2f4;
            auVar58._16_4_ = fStack_3b0 * fStack_2f0;
            auVar58._20_4_ = fStack_3ac * fStack_2ec;
            auVar58._24_4_ = fStack_3a8 * fStack_2e8;
            auVar58._28_4_ = uStack_164;
            auVar155 = vsubps_avx(auVar156,auVar58);
            auVar59._4_4_ = (float)local_3c0._4_4_ * fStack_9c;
            auVar59._0_4_ = (float)local_3c0._0_4_ * local_a0;
            auVar59._8_4_ = fStack_3b8 * fStack_98;
            auVar59._12_4_ = fStack_3b4 * fStack_94;
            auVar59._16_4_ = fStack_3b0 * fStack_90;
            auVar59._20_4_ = fStack_3ac * fStack_8c;
            auVar59._24_4_ = fStack_3a8 * fStack_88;
            auVar59._28_4_ = uStack_164;
            auVar69 = vsubps_avx(auVar163,auVar59);
            auVar60._4_4_ = (float)local_3c0._4_4_ * fStack_2bc;
            auVar60._0_4_ = (float)local_3c0._0_4_ * local_2c0;
            auVar60._8_4_ = fStack_3b8 * fStack_2b8;
            auVar60._12_4_ = fStack_3b4 * fStack_2b4;
            auVar60._16_4_ = fStack_3b0 * fStack_2b0;
            auVar60._20_4_ = fStack_3ac * fStack_2ac;
            auVar60._24_4_ = fStack_3a8 * fStack_2a8;
            auVar60._28_4_ = uStack_164;
            auVar167 = vsubps_avx(auVar168,auVar60);
            local_420 = vblendvps_avx(auVar146,auVar155,auVar21);
            local_400 = vblendvps_avx(auVar124,auVar69,auVar21);
            local_3e0 = vblendvps_avx(auVar186,auVar167,auVar21);
            auVar61._4_4_ = (float)local_3c0._4_4_ * (float)local_600._4_4_;
            auVar61._0_4_ = (float)local_3c0._0_4_ * (float)local_600._0_4_;
            auVar61._8_4_ = fStack_3b8 * fStack_5f8;
            auVar61._12_4_ = fStack_3b4 * fStack_5f4;
            auVar61._16_4_ = fStack_3b0 * fStack_5f0;
            auVar61._20_4_ = fStack_3ac * fStack_5ec;
            auVar61._24_4_ = fStack_3a8 * fStack_5e8;
            auVar61._28_4_ = auVar155._28_4_;
            local_480 = vblendvps_avx(auVar103,auVar61,auVar21);
            auVar147 = ZEXT864(0) << 0x20;
            local_460 = ZEXT832(0) << 0x20;
            local_440 = _local_5e0;
            auVar106._8_4_ = 0x7f800000;
            auVar106._0_8_ = 0x7f8000007f800000;
            auVar106._12_4_ = 0x7f800000;
            auVar106._16_4_ = 0x7f800000;
            auVar106._20_4_ = 0x7f800000;
            auVar106._24_4_ = 0x7f800000;
            auVar106._28_4_ = 0x7f800000;
            auVar124 = vblendvps_avx(auVar106,_local_5e0,auVar97);
            auVar146 = vshufps_avx(auVar124,auVar124,0xb1);
            auVar146 = vminps_avx(auVar124,auVar146);
            auVar155 = vshufpd_avx(auVar146,auVar146,5);
            auVar146 = vminps_avx(auVar146,auVar155);
            auVar155 = vpermpd_avx2(auVar146,0x4e);
            auVar146 = vminps_avx(auVar146,auVar155);
            auVar124 = vcmpps_avx(auVar124,auVar146,0);
            auVar23 = vpackssdw_avx(auVar124._0_16_,auVar124._16_16_);
            auVar118 = vpand_avx(auVar23,auVar118);
            local_6a0 = vpsrad_avx2(auVar97,0x1f);
            pSVar65 = context->scene;
            auVar124 = vpmovzxwd_avx2(auVar118);
            auVar124 = vpslld_avx2(auVar124,0x1f);
            if ((((((((auVar124 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar124 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar124 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar124 >> 0x7f,0) == '\0') &&
                  (auVar124 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar124 >> 0xbf,0) == '\0') &&
                (auVar124 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar124[0x1f]) {
              auVar124 = local_6a0;
            }
            uVar62 = vmovmskps_avx(auVar124);
            uVar63 = 0;
            for (; (uVar62 & 1) == 0; uVar62 = uVar62 >> 1 | 0x80000000) {
              uVar63 = uVar63 + 1;
            }
            iVar64 = 1 << ((uint)k & 0x1f);
            auVar76._4_4_ = iVar64;
            auVar76._0_4_ = iVar64;
            auVar76._8_4_ = iVar64;
            auVar76._12_4_ = iVar64;
            auVar76._16_4_ = iVar64;
            auVar76._20_4_ = iVar64;
            auVar76._24_4_ = iVar64;
            auVar76._28_4_ = iVar64;
            auVar146 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
            auVar124 = vpand_avx2(auVar76,auVar146);
            auVar124 = vpcmpeqd_avx2(auVar124,auVar146);
            auVar164 = ZEXT3264(auVar124);
            auVar124 = vpcmpeqd_avx2(auVar60,auVar60);
            auVar169 = ZEXT3264(auVar124);
            do {
              local_6d0.hit = (RTCHitN *)local_2a0;
              local_6d0.valid = (int *)local_680;
              uVar66 = (ulong)uVar63;
              local_1e0._4_4_ = local_160[uVar66];
              pGVar10 = (pSVar65->geometries).items[(uint)local_1e0._4_4_].ptr;
              if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                *(undefined4 *)(local_6a0 + uVar66 * 4) = 0;
              }
              else {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  uVar67 = *(undefined4 *)(local_480 + uVar66 * 4);
                  uVar1 = *(undefined4 *)(local_460 + uVar66 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_440 + uVar66 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x180) = *(undefined4 *)(local_420 + uVar66 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x1a0) = *(undefined4 *)(local_400 + uVar66 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x1c0) = *(undefined4 *)(local_3e0 + uVar66 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x1e0) = uVar67;
                  *(undefined4 *)(ray + k * 4 + 0x200) = uVar1;
                  *(uint *)(ray + k * 4 + 0x220) = (line->primIDs).field_0.i[uVar66];
                  *(undefined4 *)(ray + k * 4 + 0x240) = local_1e0._4_4_;
                  *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                  return;
                }
                local_240 = *(undefined4 *)(local_480 + uVar66 * 4);
                local_220 = *(undefined4 *)(local_460 + uVar66 * 4);
                local_200._4_4_ = (line->primIDs).field_0.i[uVar66];
                uVar67 = *(undefined4 *)(local_420 + uVar66 * 4);
                local_2a0._4_4_ = uVar67;
                local_2a0._0_4_ = uVar67;
                local_2a0._8_4_ = uVar67;
                local_2a0._12_4_ = uVar67;
                local_2a0._16_4_ = uVar67;
                local_2a0._20_4_ = uVar67;
                local_2a0._24_4_ = uVar67;
                local_2a0._28_4_ = uVar67;
                uVar67 = *(undefined4 *)(local_400 + uVar66 * 4);
                local_280._4_4_ = uVar67;
                local_280._0_4_ = uVar67;
                local_280._8_4_ = uVar67;
                local_280._12_4_ = uVar67;
                local_280._16_4_ = uVar67;
                local_280._20_4_ = uVar67;
                local_280._24_4_ = uVar67;
                local_280._28_4_ = uVar67;
                uVar67 = *(undefined4 *)(local_3e0 + uVar66 * 4);
                local_260._4_4_ = uVar67;
                local_260._0_4_ = uVar67;
                local_260._8_4_ = uVar67;
                local_260._12_4_ = uVar67;
                local_260._16_4_ = uVar67;
                local_260._20_4_ = uVar67;
                local_260._24_4_ = uVar67;
                local_260._28_4_ = uVar67;
                uStack_23c = local_240;
                uStack_238 = local_240;
                uStack_234 = local_240;
                uStack_230 = local_240;
                uStack_22c = local_240;
                uStack_228 = local_240;
                uStack_224 = local_240;
                uStack_21c = local_220;
                uStack_218 = local_220;
                uStack_214 = local_220;
                uStack_210 = local_220;
                uStack_20c = local_220;
                uStack_208 = local_220;
                uStack_204 = local_220;
                local_200._0_4_ = local_200._4_4_;
                local_200._8_4_ = local_200._4_4_;
                local_200._12_4_ = local_200._4_4_;
                local_200._16_4_ = local_200._4_4_;
                local_200._20_4_ = local_200._4_4_;
                local_200._24_4_ = local_200._4_4_;
                local_200._28_4_ = local_200._4_4_;
                local_1e0._0_4_ = local_1e0._4_4_;
                local_1e0._8_4_ = local_1e0._4_4_;
                local_1e0._12_4_ = local_1e0._4_4_;
                local_1e0._16_4_ = local_1e0._4_4_;
                local_1e0._20_4_ = local_1e0._4_4_;
                local_1e0._24_4_ = local_1e0._4_4_;
                local_1e0._28_4_ = local_1e0._4_4_;
                uStack_1bc = context->user->instID[0];
                local_1c0 = uStack_1bc;
                uStack_1b8 = uStack_1bc;
                uStack_1b4 = uStack_1bc;
                uStack_1b0 = uStack_1bc;
                uStack_1ac = uStack_1bc;
                uStack_1a8 = uStack_1bc;
                uStack_1a4 = uStack_1bc;
                uStack_19c = context->user->instPrimID[0];
                local_1a0 = uStack_19c;
                uStack_198 = uStack_19c;
                uStack_194 = uStack_19c;
                uStack_190 = uStack_19c;
                uStack_18c = uStack_19c;
                uStack_188 = uStack_19c;
                uStack_184 = uStack_19c;
                uVar67 = *(undefined4 *)(ray + k * 4 + 0x100);
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_440 + uVar66 * 4);
                local_680 = auVar164._0_32_;
                local_6d0.geometryUserPtr = pGVar10->userPtr;
                local_6d0.context = context->user;
                local_6d0.N = 8;
                local_6d0.ray = (RTCRayN *)ray;
                if (pGVar10->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                  local_620._0_8_ = pSVar65;
                  local_660._0_4_ = uVar67;
                  auVar124 = ZEXT1632(auVar169._0_16_);
                  local_640 = local_680;
                  (*pGVar10->intersectionFilterN)(&local_6d0);
                  auVar124 = vpcmpeqd_avx2(auVar124,auVar124);
                  auVar169 = ZEXT3264(auVar124);
                  auVar164 = ZEXT3264(local_640);
                  auVar147 = ZEXT1664(ZEXT816(0) << 0x40);
                  pSVar65 = (Scene *)local_620._0_8_;
                  uVar67 = local_660._0_4_;
                }
                auVar146 = vpcmpeqd_avx2(auVar147._0_32_,local_680);
                auVar124 = auVar169._0_32_ & ~auVar146;
                if ((((((((auVar124 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar124 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar124 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar124 >> 0x7f,0) == '\0') &&
                      (auVar124 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar124 >> 0xbf,0) == '\0') &&
                    (auVar124 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar124[0x1f]) {
                  auVar146 = auVar169._0_32_ ^ auVar146;
                }
                else {
                  p_Var12 = context->args->filter;
                  if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar10->field_8).field_0x2 & 0x40) != 0)
                      ))) {
                    local_620._0_8_ = pSVar65;
                    local_640 = auVar164._0_32_;
                    local_660._0_4_ = uVar67;
                    auVar124 = ZEXT1632(auVar169._0_16_);
                    (*p_Var12)(&local_6d0);
                    auVar124 = vpcmpeqd_avx2(auVar124,auVar124);
                    auVar169 = ZEXT3264(auVar124);
                    auVar164 = ZEXT3264(local_640);
                    auVar147 = ZEXT1664(ZEXT816(0) << 0x40);
                    pSVar65 = (Scene *)local_620._0_8_;
                    uVar67 = local_660._0_4_;
                  }
                  auVar155 = vpcmpeqd_avx2(auVar147._0_32_,local_680);
                  auVar146 = auVar169._0_32_ ^ auVar155;
                  auVar124 = auVar169._0_32_ & ~auVar155;
                  if ((((((((auVar124 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar124 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar124 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar124 >> 0x7f,0) != '\0') ||
                        (auVar124 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar124 >> 0xbf,0) != '\0') ||
                      (auVar124 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar124[0x1f] < '\0') {
                    auVar99._0_4_ = auVar169._0_4_ ^ auVar155._0_4_;
                    auVar99._4_4_ = auVar169._4_4_ ^ auVar155._4_4_;
                    auVar99._8_4_ = auVar169._8_4_ ^ auVar155._8_4_;
                    auVar99._12_4_ = auVar169._12_4_ ^ auVar155._12_4_;
                    auVar99._16_4_ = auVar169._16_4_ ^ auVar155._16_4_;
                    auVar99._20_4_ = auVar169._20_4_ ^ auVar155._20_4_;
                    auVar99._24_4_ = auVar169._24_4_ ^ auVar155._24_4_;
                    auVar99._28_4_ = auVar169._28_4_ ^ auVar155._28_4_;
                    auVar124 = vmaskmovps_avx(auVar99,*(undefined1 (*) [32])local_6d0.hit);
                    *(undefined1 (*) [32])(local_6d0.ray + 0x180) = auVar124;
                    auVar124 = vmaskmovps_avx(auVar99,*(undefined1 (*) [32])(local_6d0.hit + 0x20));
                    *(undefined1 (*) [32])(local_6d0.ray + 0x1a0) = auVar124;
                    auVar124 = vmaskmovps_avx(auVar99,*(undefined1 (*) [32])(local_6d0.hit + 0x40));
                    *(undefined1 (*) [32])(local_6d0.ray + 0x1c0) = auVar124;
                    auVar124 = vmaskmovps_avx(auVar99,*(undefined1 (*) [32])(local_6d0.hit + 0x60));
                    *(undefined1 (*) [32])(local_6d0.ray + 0x1e0) = auVar124;
                    auVar124 = vmaskmovps_avx(auVar99,*(undefined1 (*) [32])(local_6d0.hit + 0x80));
                    *(undefined1 (*) [32])(local_6d0.ray + 0x200) = auVar124;
                    auVar124 = vpmaskmovd_avx2(auVar99,*(undefined1 (*) [32])(local_6d0.hit + 0xa0))
                    ;
                    *(undefined1 (*) [32])(local_6d0.ray + 0x220) = auVar124;
                    auVar124 = vpmaskmovd_avx2(auVar99,*(undefined1 (*) [32])(local_6d0.hit + 0xc0))
                    ;
                    *(undefined1 (*) [32])(local_6d0.ray + 0x240) = auVar124;
                    auVar124 = vpmaskmovd_avx2(auVar99,*(undefined1 (*) [32])(local_6d0.hit + 0xe0))
                    ;
                    *(undefined1 (*) [32])(local_6d0.ray + 0x260) = auVar124;
                    auVar124 = vpmaskmovd_avx2(auVar99,*(undefined1 (*) [32])(local_6d0.hit + 0x100)
                                              );
                    *(undefined1 (*) [32])(local_6d0.ray + 0x280) = auVar124;
                  }
                }
                if ((((((((auVar146 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar146 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar146 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar146 >> 0x7f,0) == '\0') &&
                      (auVar146 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar146 >> 0xbf,0) == '\0') &&
                    (auVar146 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar146[0x1f]) {
                  *(undefined4 *)(ray + k * 4 + 0x100) = uVar67;
                }
                *(undefined4 *)(local_6a0 + uVar66 * 4) = 0;
                uVar67 = *(undefined4 *)(ray + k * 4 + 0x100);
                auVar77._4_4_ = uVar67;
                auVar77._0_4_ = uVar67;
                auVar77._8_4_ = uVar67;
                auVar77._12_4_ = uVar67;
                auVar77._16_4_ = uVar67;
                auVar77._20_4_ = uVar67;
                auVar77._24_4_ = uVar67;
                auVar77._28_4_ = uVar67;
                auVar124 = vcmpps_avx(_local_5e0,auVar77,2);
                local_6a0 = vandps_avx(auVar124,local_6a0);
              }
              if ((((((((local_6a0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (local_6a0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (local_6a0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(local_6a0 >> 0x7f,0) == '\0') &&
                    (local_6a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(local_6a0 >> 0xbf,0) == '\0') &&
                  (local_6a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < local_6a0[0x1f]) {
                return;
              }
              auVar98._8_4_ = 0x7f800000;
              auVar98._0_8_ = 0x7f8000007f800000;
              auVar98._12_4_ = 0x7f800000;
              auVar98._16_4_ = 0x7f800000;
              auVar98._20_4_ = 0x7f800000;
              auVar98._24_4_ = 0x7f800000;
              auVar98._28_4_ = 0x7f800000;
              auVar124 = vblendvps_avx(auVar98,_local_5e0,local_6a0);
              auVar146 = vshufps_avx(auVar124,auVar124,0xb1);
              auVar146 = vminps_avx(auVar124,auVar146);
              auVar155 = vshufpd_avx(auVar146,auVar146,5);
              auVar146 = vminps_avx(auVar146,auVar155);
              auVar155 = vpermpd_avx2(auVar146,0x4e);
              auVar146 = vminps_avx(auVar146,auVar155);
              auVar146 = vcmpps_avx(auVar124,auVar146,0);
              auVar155 = local_6a0 & auVar146;
              auVar124 = local_6a0;
              if ((((((((auVar155 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar155 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar155 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar155 >> 0x7f,0) != '\0') ||
                    (auVar155 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar155 >> 0xbf,0) != '\0') ||
                  (auVar155 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar155[0x1f] < '\0') {
                auVar124 = vandps_avx(auVar146,local_6a0);
              }
              uVar62 = vmovmskps_avx(auVar124);
              uVar63 = 0;
              for (; (uVar62 & 1) == 0; uVar62 = uVar62 >> 1 | 0x80000000) {
                uVar63 = uVar63 + 1;
              }
            } while( true );
          }
          local_560 = auVar182._0_32_;
          local_240 = *(undefined4 *)(local_480 + uVar66 * 4);
          local_220 = *(undefined4 *)(local_460 + uVar66 * 4);
          uVar62 = (line->primIDs).field_0.i[uVar66];
          auVar118._4_4_ = uVar62;
          auVar118._0_4_ = uVar62;
          auVar118._8_4_ = uVar62;
          auVar118._12_4_ = uVar62;
          auVar127._16_4_ = uVar62;
          auVar127._0_16_ = auVar118;
          auVar127._20_4_ = uVar62;
          auVar127._24_4_ = uVar62;
          auVar127._28_4_ = uVar62;
          local_2a0._4_4_ = *(undefined4 *)(local_420 + uVar66 * 4);
          local_280._4_4_ = *(undefined4 *)(local_400 + uVar66 * 4);
          local_260._4_4_ = *(undefined4 *)(local_3e0 + uVar66 * 4);
          local_1e0._4_4_ = uVar63;
          local_1e0._0_4_ = uVar63;
          local_1e0._8_4_ = uVar63;
          local_1e0._12_4_ = uVar63;
          local_1e0._16_4_ = uVar63;
          local_1e0._20_4_ = uVar63;
          local_1e0._24_4_ = uVar63;
          local_1e0._28_4_ = uVar63;
          local_2a0._0_4_ = local_2a0._4_4_;
          local_2a0._8_4_ = local_2a0._4_4_;
          local_2a0._12_4_ = local_2a0._4_4_;
          local_2a0._16_4_ = local_2a0._4_4_;
          local_2a0._20_4_ = local_2a0._4_4_;
          local_2a0._24_4_ = local_2a0._4_4_;
          local_2a0._28_4_ = local_2a0._4_4_;
          local_280._0_4_ = local_280._4_4_;
          local_280._8_4_ = local_280._4_4_;
          local_280._12_4_ = local_280._4_4_;
          local_280._16_4_ = local_280._4_4_;
          local_280._20_4_ = local_280._4_4_;
          local_280._24_4_ = local_280._4_4_;
          local_280._28_4_ = local_280._4_4_;
          local_260._0_4_ = local_260._4_4_;
          local_260._8_4_ = local_260._4_4_;
          local_260._12_4_ = local_260._4_4_;
          local_260._16_4_ = local_260._4_4_;
          local_260._20_4_ = local_260._4_4_;
          local_260._24_4_ = local_260._4_4_;
          local_260._28_4_ = local_260._4_4_;
          uStack_23c = local_240;
          uStack_238 = local_240;
          uStack_234 = local_240;
          uStack_230 = local_240;
          uStack_22c = local_240;
          uStack_228 = local_240;
          uStack_224 = local_240;
          uStack_21c = local_220;
          uStack_218 = local_220;
          uStack_214 = local_220;
          uStack_210 = local_220;
          uStack_20c = local_220;
          uStack_208 = local_220;
          uStack_204 = local_220;
          local_200 = auVar127;
          auVar124 = vpcmpeqd_avx2(local_1e0,local_1e0);
          uStack_1bc = context->user->instID[0];
          local_1c0 = uStack_1bc;
          uStack_1b8 = uStack_1bc;
          uStack_1b4 = uStack_1bc;
          uStack_1b0 = uStack_1bc;
          uStack_1ac = uStack_1bc;
          uStack_1a8 = uStack_1bc;
          uStack_1a4 = uStack_1bc;
          uStack_19c = context->user->instPrimID[0];
          local_1a0 = uStack_19c;
          uStack_198 = uStack_19c;
          uStack_194 = uStack_19c;
          uStack_190 = uStack_19c;
          uStack_18c = uStack_19c;
          uStack_188 = uStack_19c;
          uStack_184 = uStack_19c;
          local_580._0_4_ = *(undefined4 *)(ray + k * 4 + 0x100);
          *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_440 + uVar66 * 4);
          local_680 = local_3a0;
          local_6d0.geometryUserPtr = pGVar10->userPtr;
          local_6d0.context = context->user;
          local_6d0.N = 8;
          if (pGVar10->intersectionFilterN != (RTCFilterFunctionN)0x0) {
            auVar124 = ZEXT1632(auVar124._0_16_);
            auVar127 = ZEXT1632(auVar118);
            local_5a0 = auVar103;
            (*pGVar10->intersectionFilterN)(&local_6d0);
            auVar124 = vpcmpeqd_avx2(auVar124,auVar124);
            auVar206 = ZEXT3264(local_5a0);
            auVar147 = ZEXT3264(local_4e0);
            auVar197 = ZEXT3264(local_360);
            auVar184 = ZEXT3264(_local_4c0);
            auVar181 = ZEXT3264(_local_4a0);
            auVar169 = ZEXT3264(CONCAT428(fStack_324,
                                          CONCAT424(fStack_328,
                                                    CONCAT420(fStack_32c,
                                                              CONCAT416(fStack_330,
                                                                        CONCAT412(fStack_334,
                                                                                  CONCAT48(
                                                  fStack_338,CONCAT44(fStack_33c,local_340))))))));
            auVar175 = ZEXT3264(local_320);
            auVar164 = ZEXT3264(local_660);
            auVar187 = ZEXT3264(local_380);
          }
          auVar155 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),local_680);
          auVar146 = auVar124 & ~auVar155;
          auVar182 = ZEXT3264(local_560);
          if ((((((((auVar146 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar146 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar146 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar146 >> 0x7f,0) == '\0') &&
                (auVar146 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar146 >> 0xbf,0) == '\0') &&
              (auVar146 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar146[0x1f]) {
            auVar78 = ZEXT3264(auVar155 ^ auVar124);
            auVar133 = ZEXT3264(local_640);
            auVar157 = ZEXT3264(local_5c0);
          }
          else {
            p_Var12 = context->args->filter;
            if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
              local_5a0 = auVar206._0_32_;
              auVar124 = ZEXT1632(auVar124._0_16_);
              auVar127 = ZEXT1632(auVar127._0_16_);
              (*p_Var12)(&local_6d0);
              auVar124 = vpcmpeqd_avx2(auVar124,auVar124);
              auVar182 = ZEXT3264(local_560);
              auVar206 = ZEXT3264(local_5a0);
              auVar147 = ZEXT3264(local_4e0);
              auVar197 = ZEXT3264(local_360);
              auVar184 = ZEXT3264(_local_4c0);
              auVar181 = ZEXT3264(_local_4a0);
              auVar169 = ZEXT3264(CONCAT428(fStack_324,
                                            CONCAT424(fStack_328,
                                                      CONCAT420(fStack_32c,
                                                                CONCAT416(fStack_330,
                                                                          CONCAT412(fStack_334,
                                                                                    CONCAT48(
                                                  fStack_338,CONCAT44(fStack_33c,local_340))))))));
              auVar175 = ZEXT3264(local_320);
              auVar164 = ZEXT3264(local_660);
              auVar187 = ZEXT3264(local_380);
            }
            auVar146 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),local_680);
            auVar78 = ZEXT3264(auVar146 ^ auVar124);
            auVar155 = vpcmpeqd_avx2(auVar127,auVar127);
            auVar124 = auVar124 & ~auVar146;
            auVar133 = ZEXT3264(local_640);
            auVar157 = ZEXT3264(local_5c0);
            if ((((((((auVar124 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar124 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar124 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar124 >> 0x7f,0) != '\0') ||
                  (auVar124 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar124 >> 0xbf,0) != '\0') ||
                (auVar124 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar124[0x1f] < '\0') {
              auVar146 = auVar146 ^ auVar155;
              auVar124 = vmaskmovps_avx(auVar146,*(undefined1 (*) [32])local_6d0.hit);
              *(undefined1 (*) [32])(local_6d0.ray + 0x180) = auVar124;
              auVar124 = vmaskmovps_avx(auVar146,*(undefined1 (*) [32])(local_6d0.hit + 0x20));
              *(undefined1 (*) [32])(local_6d0.ray + 0x1a0) = auVar124;
              auVar124 = vmaskmovps_avx(auVar146,*(undefined1 (*) [32])(local_6d0.hit + 0x40));
              *(undefined1 (*) [32])(local_6d0.ray + 0x1c0) = auVar124;
              auVar124 = vmaskmovps_avx(auVar146,*(undefined1 (*) [32])(local_6d0.hit + 0x60));
              *(undefined1 (*) [32])(local_6d0.ray + 0x1e0) = auVar124;
              auVar124 = vmaskmovps_avx(auVar146,*(undefined1 (*) [32])(local_6d0.hit + 0x80));
              *(undefined1 (*) [32])(local_6d0.ray + 0x200) = auVar124;
              auVar124 = vpmaskmovd_avx2(auVar146,*(undefined1 (*) [32])(local_6d0.hit + 0xa0));
              *(undefined1 (*) [32])(local_6d0.ray + 0x220) = auVar124;
              auVar124 = vpmaskmovd_avx2(auVar146,*(undefined1 (*) [32])(local_6d0.hit + 0xc0));
              *(undefined1 (*) [32])(local_6d0.ray + 0x240) = auVar124;
              auVar124 = vpmaskmovd_avx2(auVar146,*(undefined1 (*) [32])(local_6d0.hit + 0xe0));
              *(undefined1 (*) [32])(local_6d0.ray + 0x260) = auVar124;
              auVar124 = vpmaskmovd_avx2(auVar146,*(undefined1 (*) [32])(local_6d0.hit + 0x100));
              *(undefined1 (*) [32])(local_6d0.ray + 0x280) = auVar124;
            }
          }
          auVar124 = auVar78._0_32_;
          if ((((((((auVar124 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar124 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar124 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar124 >> 0x7f,0) == '\0') &&
                (auVar78 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
               SUB321(auVar124 >> 0xbf,0) == '\0') &&
              (auVar78 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
              -1 < auVar78[0x1f]) {
            *(undefined4 *)(ray + k * 4 + 0x100) = local_580._0_4_;
          }
          *(undefined4 *)(local_6a0 + uVar66 * 4) = 0;
          uVar67 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar74._4_4_ = uVar67;
          auVar74._0_4_ = uVar67;
          auVar74._8_4_ = uVar67;
          auVar74._12_4_ = uVar67;
          auVar74._16_4_ = uVar67;
          auVar74._20_4_ = uVar67;
          auVar74._24_4_ = uVar67;
          auVar74._28_4_ = uVar67;
          auVar124 = vcmpps_avx(auVar182._0_32_,auVar74,2);
          local_6a0 = vandps_avx(auVar124,local_6a0);
        }
        auVar167 = auVar169._0_32_;
        auVar69 = auVar164._0_32_;
        auVar103 = auVar206._0_32_;
        auVar102 = auVar184._0_32_;
        auVar90 = auVar181._0_32_;
        auVar172 = auVar175._0_28_;
        auVar155 = auVar157._0_32_;
        auVar186 = auVar187._0_32_;
        auVar124 = auVar133._0_32_;
        auVar146 = auVar147._0_32_;
        auVar119 = auVar197._0_32_;
        if ((((((((local_6a0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (local_6a0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (local_6a0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(local_6a0 >> 0x7f,0) == '\0') &&
              (local_6a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(local_6a0 >> 0xbf,0) == '\0') &&
            (local_6a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < local_6a0[0x1f]) goto LAB_018005cd;
        auVar96._8_4_ = 0x7f800000;
        auVar96._0_8_ = 0x7f8000007f800000;
        auVar96._12_4_ = 0x7f800000;
        auVar96._16_4_ = 0x7f800000;
        auVar96._20_4_ = 0x7f800000;
        auVar96._24_4_ = 0x7f800000;
        auVar96._28_4_ = 0x7f800000;
        auVar124 = vblendvps_avx(auVar96,auVar182._0_32_,local_6a0);
        auVar146 = vshufps_avx(auVar124,auVar124,0xb1);
        auVar146 = vminps_avx(auVar124,auVar146);
        auVar155 = vshufpd_avx(auVar146,auVar146,5);
        auVar146 = vminps_avx(auVar146,auVar155);
        auVar155 = vpermpd_avx2(auVar146,0x4e);
        auVar146 = vminps_avx(auVar146,auVar155);
        auVar146 = vcmpps_avx(auVar124,auVar146,0);
        auVar155 = local_6a0 & auVar146;
        auVar124 = local_6a0;
        if ((((((((auVar155 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar155 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar155 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar155 >> 0x7f,0) != '\0') ||
              (auVar155 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar155 >> 0xbf,0) != '\0') ||
            (auVar155 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar155[0x1f] < '\0') {
          auVar124 = vandps_avx(auVar146,local_6a0);
        }
        uVar62 = vmovmskps_avx(auVar124);
        uVar63 = 0;
        for (; (uVar62 & 1) == 0; uVar62 = uVar62 >> 1 | 0x80000000) {
          uVar63 = uVar63 + 1;
        }
      } while( true );
    }
  }
  return;
}

Assistant:

static __forceinline void intersect(const Precalculations& pre, RayHitK<K>& ray, size_t k, RayQueryContext* context, const Primitive& line)
      {
        STAT3(normal.trav_prims,1,1,1);
        const LineSegments* geom = context->scene->get<LineSegments>(line.geomID());
        Vec4vf<M> v0,v1; 
        vbool<M> cL,cR;
        line.gather(v0,v1,cL,cR,geom);
        const vbool<M> valid = line.valid();
        ConeCurveIntersectorK<M,K>::intersect(valid,ray,k,context,geom,pre,v0,v1,cL,cR,Intersect1KEpilogM<M,K,filter>(ray,k,context,line.geomID(),line.primID()));
      }